

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 *puVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  long lVar5;
  Ref<embree::Geometry> *pRVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined4 in_EAX;
  int iVar18;
  int iVar19;
  AABBNodeMB4D *node1;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined8 uVar24;
  undefined4 uVar25;
  int iVar26;
  Intersectors *pIVar27;
  size_t sVar28;
  NodeRef root;
  ulong uVar29;
  float *vertices1;
  ulong uVar30;
  ulong uVar31;
  vuint<4> *v;
  long lVar32;
  long lVar33;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar34;
  ulong uVar35;
  QuadMesh *mesh;
  NodeRef *pNVar36;
  bool bVar37;
  float fVar38;
  float fVar39;
  float fVar58;
  float fVar60;
  vint4 ai;
  undefined1 auVar40 [16];
  float fVar62;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar59;
  float fVar61;
  float fVar63;
  float fVar64;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar57;
  float fVar65;
  float fVar78;
  float fVar81;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar66;
  float fVar67;
  float fVar79;
  float fVar80;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar71 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar76;
  undefined1 auVar77 [16];
  float fVar86;
  float fVar87;
  float fVar100;
  float fVar102;
  undefined1 auVar88 [16];
  float fVar104;
  undefined1 auVar89 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar90;
  undefined1 auVar91 [16];
  float fVar101;
  float fVar103;
  float fVar105;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar106;
  float fVar107;
  float fVar114;
  float fVar116;
  vint4 ai_1;
  undefined1 auVar108 [16];
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar120;
  float fVar121;
  float fVar128;
  float fVar130;
  vint4 ai_3;
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar134;
  float fVar138;
  float fVar139;
  vint4 bi_3;
  float fVar140;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar141;
  float fVar149;
  float fVar150;
  vint4 bi;
  undefined1 auVar142 [16];
  float fVar151;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar161;
  float fVar162;
  float fVar166;
  vint4 bi_1;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar156 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar178;
  uint uVar180;
  vint4 ai_2;
  undefined1 auVar174 [16];
  uint uVar183;
  undefined1 auVar175 [16];
  float fVar179;
  float fVar181;
  float fVar182;
  float fVar184;
  float fVar185;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  uint uVar186;
  uint uVar190;
  uint uVar191;
  vint4 bi_2;
  uint uVar192;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  uint uVar193;
  float fVar194;
  uint uVar196;
  float fVar197;
  float fVar198;
  uint uVar199;
  float fVar200;
  uint uVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar195 [16];
  float fVar205;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  uint uVar212;
  uint uVar219;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar220;
  float fVar226;
  float fVar228;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar222;
  float fVar221;
  float fVar227;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar232;
  float fVar233;
  int iVar234;
  float fVar235;
  float fVar236;
  int iVar237;
  float fVar238;
  float fVar239;
  int iVar240;
  float fVar241;
  float fVar242;
  TravRayK<4,_true> *tray_00;
  vuint<4> *v_1;
  uint local_1ab8;
  uint uStack_1ab4;
  uint uStack_1ab0;
  uint uStack_1aac;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  float local_1a48;
  float fStack_1a44;
  float fStack_1a40;
  float fStack_1a3c;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float local_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  vbool<4> terminated;
  undefined1 local_19d8 [16];
  Vec3<embree::vfloat_impl<4>_> p0;
  float local_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  TravRayK<4,_true> tray;
  float local_1748;
  float fStack_1744;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar213 [16];
  
  auVar77 = mm_lookupmask_ps._240_16_;
  uVar17 = mm_lookupmask_ps._8_8_;
  uVar16 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar215._8_4_ = 0xffffffff;
    auVar215._0_8_ = 0xffffffffffffffff;
    auVar215._12_4_ = 0xffffffff;
    auVar142 = *(undefined1 (*) [16])(ray + 0x80);
    auVar144._0_12_ = ZEXT812(0);
    auVar144._12_4_ = 0;
    uVar212 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar142._0_4_);
    uVar219 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar142._4_4_);
    auVar213._0_8_ = CONCAT44(uVar219,uVar212);
    auVar213._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar142._8_4_);
    auVar213._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar142._12_4_);
    iVar18 = movmskps(in_EAX,auVar213);
    if (iVar18 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      uVar193 = (uint)DAT_01fec6c0;
      uVar196 = DAT_01fec6c0._4_4_;
      uVar199 = DAT_01fec6c0._8_4_;
      uVar201 = DAT_01fec6c0._12_4_;
      auVar174 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      fVar205 = (float)DAT_01ff1d40;
      fVar208 = DAT_01ff1d40._4_4_;
      fVar209 = DAT_01ff1d40._8_4_;
      fVar210 = DAT_01ff1d40._12_4_;
      auVar88._4_4_ = -(uint)((float)(tray.dir.field_0._4_4_ & uVar196) < fVar208);
      auVar88._0_4_ = -(uint)((float)(tray.dir.field_0._0_4_ & uVar193) < fVar205);
      auVar88._8_4_ = -(uint)((float)(tray.dir.field_0._8_4_ & uVar199) < fVar209);
      auVar88._12_4_ = -(uint)((float)(tray.dir.field_0._12_4_ & uVar201) < fVar210);
      auVar108 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar224._4_4_ = -(uint)((float)(tray.dir.field_0._20_4_ & uVar196) < fVar208);
      auVar224._0_4_ = -(uint)((float)(tray.dir.field_0._16_4_ & uVar193) < fVar205);
      auVar68 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar174,_DAT_0201c930,auVar88)
      ;
      auVar224._8_4_ = -(uint)((float)(tray.dir.field_0._24_4_ & uVar199) < fVar209);
      auVar224._12_4_ = -(uint)((float)(tray.dir.field_0._28_4_ & uVar201) < fVar210);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)blendvps(auVar108,_DAT_0201c930,auVar224);
      auVar108._4_4_ = -(uint)((float)(tray.dir.field_0._36_4_ & uVar196) < fVar208);
      auVar108._0_4_ = -(uint)((float)(tray.dir.field_0._32_4_ & uVar193) < fVar205);
      auVar108._8_4_ = -(uint)((float)(tray.dir.field_0._40_4_ & uVar199) < fVar209);
      auVar108._12_4_ = -(uint)((float)(tray.dir.field_0._44_4_ & uVar201) < fVar210);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar68,_DAT_0201c930,auVar108)
      ;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar68._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar68._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar68._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar68._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar68);
      auVar174._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar174._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar174._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar174._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar174);
      auVar88 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar144);
      iVar18 = (int)DAT_01feb9f0;
      iVar234 = DAT_01feb9f0._4_4_;
      iVar237 = DAT_01feb9f0._8_4_;
      iVar240 = DAT_01feb9f0._12_4_;
      auVar40._8_4_ = auVar213._8_4_;
      auVar40._0_8_ = auVar213._0_8_;
      auVar40._12_4_ = auVar213._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar88,auVar40);
      auVar142 = maxps(auVar142,auVar144);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar142,auVar40);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar215 ^ auVar213);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar193 = 3;
      }
      else {
        uVar193 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar36 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar34 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      iVar19 = 0x224ff80;
      do {
        paVar34 = paVar34 + -1;
        root.ptr = pNVar36[-1].ptr;
        pNVar36 = pNVar36 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0024eb34:
          iVar19 = 3;
        }
        else {
          aVar90.v = *(__m128 *)paVar34->v;
          auVar142._4_4_ = -(uint)(aVar90.v[1] < tray.tfar.field_0.v[1]);
          auVar142._0_4_ = -(uint)(aVar90.v[0] < tray.tfar.field_0.v[0]);
          auVar142._8_4_ = -(uint)(aVar90.v[2] < tray.tfar.field_0.v[2]);
          auVar142._12_4_ = -(uint)(aVar90.v[3] < tray.tfar.field_0.v[3]);
          uVar196 = movmskps(iVar19,auVar142);
          if (uVar196 == 0) {
LAB_0024eb45:
            iVar19 = 2;
          }
          else {
            uVar20 = (ulong)(uVar196 & 0xff);
            uVar196 = POPCOUNT(uVar196 & 0xff);
            iVar19 = 0;
            if (uVar196 <= uVar193) {
              do {
                sVar28 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> sVar28 & 1) == 0; sVar28 = sVar28 + 1) {
                  }
                }
                tray_00 = &tray;
                bVar37 = occluded1(This,bvh,root,sVar28,&pre,ray,tray_00,context);
                if (bVar37) {
                  *(undefined4 *)(local_19d8 + sVar28 * 4 + -0x10) = 0xffffffff;
                }
                uVar20 = uVar20 & uVar20 - 1;
              } while (uVar20 != 0);
              iVar26 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
              iVar19 = 3;
              iVar18 = 0x7f800000;
              iVar234 = 0x7f800000;
              iVar237 = 0x7f800000;
              iVar240 = 0x7f800000;
              valid_i = (vint<4> *)This;
              if (iVar26 != 0xf) {
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                              (undefined1  [16])terminated.field_0);
                iVar19 = 2;
              }
            }
            if (uVar193 < uVar196) {
              do {
                fVar205 = aVar90.v[0];
                fVar208 = aVar90.v[1];
                fVar209 = aVar90.v[2];
                fVar210 = aVar90.v[3];
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_0024eb34;
                  auVar43._4_4_ = -(uint)(fVar208 < tray.tfar.field_0.v[1]);
                  auVar43._0_4_ = -(uint)(fVar205 < tray.tfar.field_0.v[0]);
                  auVar43._8_4_ = -(uint)(fVar209 < tray.tfar.field_0.v[2]);
                  auVar43._12_4_ = -(uint)(fVar210 < tray.tfar.field_0.v[3]);
                  iVar19 = movmskps(iVar19,auVar43);
                  if (iVar19 != 0) {
                    uVar21 = (ulong)((uint)root.ptr & 0xf) - 8;
                    uVar20 = uVar21;
                    aVar57 = terminated.field_0;
                    if (uVar21 != 0) {
                      local_19d8._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                      local_19d8._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                      local_19d8._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                      uVar20 = 0;
                      do {
                        lVar32 = uVar20 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                        uVar25 = movmskps((int)uVar20,local_19d8);
                        uVar22 = CONCAT44((int)(uVar20 >> 0x20),uVar25);
                        uVar35 = 0;
                        auVar142 = local_19d8;
                        while( true ) {
                          uVar196 = *(uint *)(lVar32 + 0x50 + uVar35 * 4);
                          uVar23 = (ulong)uVar196;
                          if (uVar196 == 0xffffffff) break;
                          pGVar4 = (context->scene->geometries).items
                                   [*(uint *)(lVar32 + 0x40 + uVar35 * 4)].ptr;
                          fVar205 = pGVar4->fnumTimeSegments;
                          fVar208 = (pGVar4->time_range).lower;
                          auVar91._0_4_ = (pGVar4->time_range).upper - fVar208;
                          auVar69._4_4_ = fVar208;
                          auVar69._0_4_ = fVar208;
                          auVar69._8_4_ = fVar208;
                          auVar69._12_4_ = fVar208;
                          auVar214._0_4_ = *(float *)(ray + 0x70) - fVar208;
                          auVar214._4_4_ = *(float *)(ray + 0x74) - fVar208;
                          auVar214._8_4_ = *(float *)(ray + 0x78) - fVar208;
                          auVar214._12_4_ = *(float *)(ray + 0x7c) - fVar208;
                          auVar91._4_4_ = auVar91._0_4_;
                          auVar91._8_4_ = auVar91._0_4_;
                          auVar91._12_4_ = auVar91._0_4_;
                          auVar215 = divps(auVar214,auVar91);
                          auVar216._0_4_ = auVar215._0_4_ * fVar205;
                          auVar216._4_4_ = auVar215._4_4_ * fVar205;
                          auVar216._8_4_ = auVar215._8_4_ * fVar205;
                          auVar216._12_4_ = auVar215._12_4_ * fVar205;
                          auVar215 = roundps(auVar69,auVar216,1);
                          auVar44._0_4_ = fVar205 + -1.0;
                          auVar44._4_4_ = auVar44._0_4_;
                          auVar44._8_4_ = auVar44._0_4_;
                          auVar44._12_4_ = auVar44._0_4_;
                          auVar215 = minps(auVar215,auVar44);
                          auVar215 = maxps(auVar215,ZEXT816(0));
                          fVar205 = auVar216._0_4_ - auVar215._0_4_;
                          fVar208 = auVar216._4_4_ - auVar215._4_4_;
                          fVar209 = auVar216._8_4_ - auVar215._8_4_;
                          fVar210 = auVar216._12_4_ - auVar215._12_4_;
                          itime.field_0.i[0] = (int)auVar215._0_4_;
                          itime.field_0.i[1] = (int)auVar215._4_4_;
                          itime.field_0.i[2] = (int)auVar215._8_4_;
                          itime.field_0.i[3] = (int)auVar215._12_4_;
                          uVar23 = 0;
                          if (uVar22 != 0) {
                            for (; (uVar22 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                            }
                          }
                          iVar18 = itime.field_0.i[uVar23];
                          auVar70._0_4_ = -(uint)(iVar18 == itime.field_0.i[0]);
                          auVar70._4_4_ = -(uint)(iVar18 == itime.field_0.i[1]);
                          auVar70._8_4_ = -(uint)(iVar18 == itime.field_0.i[2]);
                          auVar70._12_4_ = -(uint)(iVar18 == itime.field_0.i[3]);
                          uVar199 = movmskps((int)valid_i,~auVar70 & local_19d8);
                          valid_i = (vint<4> *)(ulong)uVar199;
                          if (uVar199 == 0) {
                            uVar23 = *(ulong *)(*(long *)&pGVar4[2].numPrimitives +
                                               (long)iVar18 * 0x38);
                            lVar5 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 +
                                             (long)iVar18 * 0x38);
                            uVar30 = (ulong)*(uint *)(lVar32 + uVar35 * 4);
                            uVar31 = (ulong)*(uint *)(lVar32 + 0x10 + uVar35 * 4);
                            pfVar1 = (float *)(uVar23 + uVar30 * 4);
                            fVar62 = *pfVar1;
                            fVar106 = pfVar1[1];
                            fVar134 = pfVar1[2];
                            pfVar1 = (float *)(lVar5 + uVar30 * 4);
                            fVar118 = *pfVar1;
                            fVar120 = pfVar1[1];
                            fVar203 = pfVar1[2];
                            fVar150 = 1.0 - fVar205;
                            fVar151 = 1.0 - fVar208;
                            fVar152 = 1.0 - fVar209;
                            fVar63 = 1.0 - fVar210;
                            fVar100 = fVar62 * fVar150 + fVar118 * fVar205;
                            fVar102 = fVar62 * fVar151 + fVar118 * fVar208;
                            fVar104 = fVar62 * fVar152 + fVar118 * fVar209;
                            fVar114 = fVar62 * fVar63 + fVar118 * fVar210;
                            fVar138 = fVar106 * fVar150 + fVar120 * fVar205;
                            fVar132 = fVar106 * fVar151 + fVar120 * fVar208;
                            fVar140 = fVar106 * fVar152 + fVar120 * fVar209;
                            fVar211 = fVar106 * fVar63 + fVar120 * fVar210;
                            fVar120 = fVar134 * fVar150 + fVar203 * fVar205;
                            fVar139 = fVar134 * fVar151 + fVar203 * fVar208;
                            fVar167 = fVar134 * fVar152 + fVar203 * fVar209;
                            fVar203 = fVar134 * fVar63 + fVar203 * fVar210;
                            pfVar1 = (float *)(uVar23 + uVar31 * 4);
                            fVar62 = *pfVar1;
                            fVar106 = pfVar1[1];
                            fVar134 = pfVar1[2];
                            pfVar1 = (float *)(lVar5 + uVar31 * 4);
                            fVar118 = *pfVar1;
                            fVar38 = pfVar1[1];
                            fVar58 = pfVar1[2];
                            fVar232 = fVar62 * fVar150 + fVar118 * fVar205;
                            fVar235 = fVar62 * fVar151 + fVar118 * fVar208;
                            fVar238 = fVar62 * fVar152 + fVar118 * fVar209;
                            fVar241 = fVar62 * fVar63 + fVar118 * fVar210;
                            fVar153 = fVar106 * fVar150 + fVar38 * fVar205;
                            fVar158 = fVar106 * fVar151 + fVar38 * fVar208;
                            fVar163 = fVar106 * fVar152 + fVar38 * fVar209;
                            fVar168 = fVar106 * fVar63 + fVar38 * fVar210;
                            fVar157 = fVar134 * fVar150 + fVar58 * fVar205;
                            fVar162 = fVar134 * fVar151 + fVar58 * fVar208;
                            fVar197 = fVar134 * fVar152 + fVar58 * fVar209;
                            fVar202 = fVar134 * fVar63 + fVar58 * fVar210;
                            uVar31 = (ulong)*(uint *)(lVar32 + 0x20 + uVar35 * 4);
                            pfVar1 = (float *)(uVar23 + uVar31 * 4);
                            fVar62 = *pfVar1;
                            fVar106 = pfVar1[1];
                            fVar134 = pfVar1[2];
                            pfVar1 = (float *)(lVar5 + uVar31 * 4);
                            fVar118 = *pfVar1;
                            fVar38 = pfVar1[1];
                            fVar58 = pfVar1[2];
                            local_18d8 = fVar62 * fVar150 + fVar118 * fVar205;
                            fStack_18d4 = fVar62 * fVar151 + fVar118 * fVar208;
                            fStack_18d0 = fVar62 * fVar152 + fVar118 * fVar209;
                            fStack_18cc = fVar62 * fVar63 + fVar118 * fVar210;
                            local_1a38 = fVar106 * fVar150 + fVar38 * fVar205;
                            fStack_1a34 = fVar106 * fVar151 + fVar38 * fVar208;
                            fStack_1a30 = fVar106 * fVar152 + fVar38 * fVar209;
                            fStack_1a2c = fVar106 * fVar63 + fVar38 * fVar210;
                            local_1a18 = fVar134 * fVar150 + fVar58 * fVar205;
                            fStack_1a14 = fVar134 * fVar151 + fVar58 * fVar208;
                            fStack_1a10 = fVar134 * fVar152 + fVar58 * fVar209;
                            fStack_1a0c = fVar134 * fVar63 + fVar58 * fVar210;
                            valid_i = (vint<4> *)(ulong)*(uint *)(lVar32 + 0x30 + uVar35 * 4);
                            pfVar1 = (float *)(lVar5 + (long)valid_i * 4);
                            fVar62 = *pfVar1;
                            fVar106 = pfVar1[1];
                            fVar134 = pfVar1[2];
                            pfVar1 = (float *)(uVar23 + (long)valid_i * 4);
                            fVar118 = *pfVar1;
                            fVar141 = pfVar1[1];
                            fVar149 = pfVar1[2];
                            fVar38 = fVar118 * fVar150 + fVar62 * fVar205;
                            fVar60 = fVar118 * fVar151 + fVar62 * fVar208;
                            fVar116 = fVar118 * fVar152 + fVar62 * fVar209;
                            fVar130 = fVar118 * fVar63 + fVar62 * fVar210;
                            fVar58 = fVar141 * fVar150 + fVar106 * fVar205;
                            fVar86 = fVar141 * fVar151 + fVar106 * fVar208;
                            fVar128 = fVar141 * fVar152 + fVar106 * fVar209;
                            fVar141 = fVar141 * fVar63 + fVar106 * fVar210;
                            fVar205 = fVar149 * fVar150 + fVar134 * fVar205;
                            fVar208 = fVar149 * fVar151 + fVar134 * fVar208;
                            fVar209 = fVar149 * fVar152 + fVar134 * fVar209;
                            fVar210 = fVar149 * fVar63 + fVar134 * fVar210;
                          }
                          else {
                            if (uVar22 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar29 = (ulong)*(uint *)(lVar32 + uVar35 * 4);
                              uVar30 = uVar22;
                              uVar31 = uVar23;
                              do {
                                lVar33 = (long)itime.field_0.i[uVar31] * 0x38;
                                valid_i = *(vint<4> **)(lVar5 + lVar33);
                                auVar215 = *(undefined1 (*) [16])
                                            ((long)&((Intersectors *)valid_i)->ptr + uVar29 * 4);
                                auVar144 = *(undefined1 (*) [16])
                                            (*(long *)(lVar5 + 0x38 + lVar33) + uVar29 * 4);
                                *(int *)((long)&p0.field_0 + uVar31 * 4) = auVar215._0_4_;
                                uVar24 = extractps(auVar215,1);
                                *(undefined8 *)((long)&p0.field_0 + uVar31 * 4 + 0x10) = uVar24;
                                uVar24 = extractps(auVar215,2);
                                *(undefined8 *)((long)&p0.field_0 + uVar31 * 4 + 0x20) = uVar24;
                                *(int *)((long)&p1.field_0 + uVar31 * 4) = auVar144._0_4_;
                                uVar24 = extractps(auVar144,1);
                                *(undefined8 *)((long)&p1.field_0 + uVar31 * 4 + 0x10) = uVar24;
                                uVar24 = extractps(auVar144,2);
                                *(undefined8 *)((long)&p1.field_0 + uVar31 * 4 + 0x20) = uVar24;
                                uVar30 = uVar30 ^ 1L << (uVar31 & 0x3f);
                                uVar31 = 0;
                                if (uVar30 != 0) {
                                  for (; (uVar30 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                                  }
                                }
                              } while (uVar30 != 0);
                            }
                            fVar62 = 1.0 - fVar205;
                            fVar106 = 1.0 - fVar208;
                            fVar134 = 1.0 - fVar209;
                            fVar118 = 1.0 - fVar210;
                            fVar100 = (float)p0.field_0._0_4_ * fVar62;
                            fVar102 = (float)p0.field_0._4_4_ * fVar106;
                            fVar104 = (float)p0.field_0._8_4_ * fVar134;
                            fVar114 = (float)p0.field_0._12_4_ * fVar118;
                            fVar138 = (float)p0.field_0._16_4_ * fVar62;
                            fVar132 = (float)p0.field_0._20_4_ * fVar106;
                            fVar140 = (float)p0.field_0._24_4_ * fVar134;
                            fVar211 = (float)p0.field_0._28_4_ * fVar118;
                            fVar120 = (float)p0.field_0._32_4_ * fVar62;
                            fVar139 = (float)p0.field_0._36_4_ * fVar106;
                            fVar167 = (float)p0.field_0._40_4_ * fVar134;
                            fVar203 = (float)p0.field_0._44_4_ * fVar118;
                            fVar38 = (float)p1.field_0._0_4_ * fVar205;
                            fVar58 = (float)p1.field_0._4_4_ * fVar208;
                            fVar60 = (float)p1.field_0._8_4_ * fVar209;
                            fVar86 = (float)p1.field_0._12_4_ * fVar210;
                            fVar149 = (float)p1.field_0._16_4_ * fVar205;
                            fVar150 = (float)p1.field_0._20_4_ * fVar208;
                            fVar151 = (float)p1.field_0._24_4_ * fVar209;
                            fVar152 = (float)p1.field_0._28_4_ * fVar210;
                            fVar116 = (float)p1.field_0._32_4_ * fVar205;
                            fVar128 = (float)p1.field_0._36_4_ * fVar208;
                            fVar130 = (float)p1.field_0._40_4_ * fVar209;
                            fVar141 = (float)p1.field_0._44_4_ * fVar210;
                            if (uVar22 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar29 = (ulong)*(uint *)(lVar32 + 0x10 + uVar35 * 4);
                              uVar30 = uVar22;
                              uVar31 = uVar23;
                              do {
                                lVar33 = (long)itime.field_0.i[uVar31] * 0x38;
                                valid_i = *(vint<4> **)(lVar5 + lVar33);
                                auVar215 = *(undefined1 (*) [16])
                                            ((long)&((Intersectors *)valid_i)->ptr + uVar29 * 4);
                                puVar2 = (undefined4 *)
                                         (*(long *)(lVar5 + 0x38 + lVar33) + uVar29 * 4);
                                uVar25 = *puVar2;
                                uVar12 = puVar2[1];
                                uVar13 = puVar2[2];
                                *(int *)((long)&p0.field_0 + uVar31 * 4) = auVar215._0_4_;
                                uVar24 = extractps(auVar215,1);
                                *(undefined8 *)((long)&p0.field_0 + uVar31 * 4 + 0x10) = uVar24;
                                uVar24 = extractps(auVar215,2);
                                *(undefined8 *)((long)&p0.field_0 + uVar31 * 4 + 0x20) = uVar24;
                                *(undefined4 *)((long)&p1.field_0 + uVar31 * 4) = uVar25;
                                *(undefined4 *)((long)&p1.field_0 + uVar31 * 4 + 0x10) = uVar12;
                                *(undefined4 *)((long)&p1.field_0 + uVar31 * 4 + 0x20) = uVar13;
                                uVar30 = uVar30 ^ 1L << (uVar31 & 0x3f);
                                uVar31 = 0;
                                if (uVar30 != 0) {
                                  for (; (uVar30 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                                  }
                                }
                              } while (uVar30 != 0);
                            }
                            fVar232 = (float)p0.field_0._0_4_ * fVar62;
                            fVar235 = (float)p0.field_0._4_4_ * fVar106;
                            fVar238 = (float)p0.field_0._8_4_ * fVar134;
                            fVar241 = (float)p0.field_0._12_4_ * fVar118;
                            fVar153 = (float)p0.field_0._16_4_ * fVar62;
                            fVar158 = (float)p0.field_0._20_4_ * fVar106;
                            fVar163 = (float)p0.field_0._24_4_ * fVar134;
                            fVar168 = (float)p0.field_0._28_4_ * fVar118;
                            fVar157 = (float)p0.field_0._32_4_ * fVar62;
                            fVar162 = (float)p0.field_0._36_4_ * fVar106;
                            fVar197 = (float)p0.field_0._40_4_ * fVar134;
                            fVar202 = (float)p0.field_0._44_4_ * fVar118;
                            fVar63 = (float)p1.field_0._0_4_ * fVar205;
                            fVar160 = (float)p1.field_0._4_4_ * fVar208;
                            fVar165 = (float)p1.field_0._8_4_ * fVar209;
                            fVar170 = (float)p1.field_0._12_4_ * fVar210;
                            fVar155 = (float)p1.field_0._16_4_ * fVar205;
                            fVar161 = (float)p1.field_0._20_4_ * fVar208;
                            fVar166 = (float)p1.field_0._24_4_ * fVar209;
                            fVar171 = (float)p1.field_0._28_4_ * fVar210;
                            fVar39 = (float)p1.field_0._32_4_ * fVar205;
                            fVar59 = (float)p1.field_0._36_4_ * fVar208;
                            fVar61 = (float)p1.field_0._40_4_ * fVar209;
                            fVar64 = (float)p1.field_0._44_4_ * fVar210;
                            if (uVar22 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar29 = (ulong)*(uint *)(lVar32 + 0x20 + uVar35 * 4);
                              uVar30 = uVar22;
                              uVar31 = uVar23;
                              do {
                                lVar33 = (long)itime.field_0.i[uVar31] * 0x38;
                                valid_i = *(vint<4> **)(lVar5 + lVar33);
                                auVar215 = *(undefined1 (*) [16])
                                            ((long)&((Intersectors *)valid_i)->ptr + uVar29 * 4);
                                auVar144 = *(undefined1 (*) [16])
                                            (*(long *)(lVar5 + 0x38 + lVar33) + uVar29 * 4);
                                *(int *)((long)&p0.field_0 + uVar31 * 4) = auVar215._0_4_;
                                uVar24 = extractps(auVar215,1);
                                *(undefined8 *)((long)&p0.field_0 + uVar31 * 4 + 0x10) = uVar24;
                                uVar24 = extractps(auVar215,2);
                                *(undefined8 *)((long)&p0.field_0 + uVar31 * 4 + 0x20) = uVar24;
                                *(int *)((long)&p1.field_0 + uVar31 * 4) = auVar144._0_4_;
                                uVar24 = extractps(auVar144,1);
                                *(undefined8 *)((long)&p1.field_0 + uVar31 * 4 + 0x10) = uVar24;
                                uVar24 = extractps(auVar144,2);
                                *(undefined8 *)((long)&p1.field_0 + uVar31 * 4 + 0x20) = uVar24;
                                uVar30 = uVar30 ^ 1L << (uVar31 & 0x3f);
                                uVar31 = 0;
                                if (uVar30 != 0) {
                                  for (; (uVar30 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                                  }
                                }
                              } while (uVar30 != 0);
                            }
                            local_18d8 = (float)p0.field_0._0_4_ * fVar62;
                            fStack_18d4 = (float)p0.field_0._4_4_ * fVar106;
                            fStack_18d0 = (float)p0.field_0._8_4_ * fVar134;
                            fStack_18cc = (float)p0.field_0._12_4_ * fVar118;
                            local_1a38 = (float)p0.field_0._16_4_ * fVar62;
                            fStack_1a34 = (float)p0.field_0._20_4_ * fVar106;
                            fStack_1a30 = (float)p0.field_0._24_4_ * fVar134;
                            fStack_1a2c = (float)p0.field_0._28_4_ * fVar118;
                            local_1a18 = (float)p0.field_0._32_4_ * fVar62;
                            fStack_1a14 = (float)p0.field_0._36_4_ * fVar106;
                            fStack_1a10 = (float)p0.field_0._40_4_ * fVar134;
                            fStack_1a0c = (float)p0.field_0._44_4_ * fVar118;
                            fVar65 = (float)p1.field_0._0_4_ * fVar205;
                            fVar66 = (float)p1.field_0._4_4_ * fVar208;
                            fVar67 = (float)p1.field_0._8_4_ * fVar209;
                            fVar78 = (float)p1.field_0._12_4_ * fVar210;
                            fVar79 = (float)p1.field_0._16_4_ * fVar205;
                            fVar80 = (float)p1.field_0._20_4_ * fVar208;
                            fVar81 = (float)p1.field_0._24_4_ * fVar209;
                            fVar82 = (float)p1.field_0._28_4_ * fVar210;
                            fVar83 = (float)p1.field_0._32_4_ * fVar205;
                            fVar84 = (float)p1.field_0._36_4_ * fVar208;
                            fVar85 = (float)p1.field_0._40_4_ * fVar209;
                            fVar87 = (float)p1.field_0._44_4_ * fVar210;
                            if (uVar22 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              valid_i = (vint<4> *)(lVar5 + 0x38);
                              uVar30 = (ulong)*(uint *)(lVar32 + 0x30 + uVar35 * 4);
                              uVar31 = uVar22;
                              do {
                                auVar215 = *(undefined1 (*) [16])
                                            (*(long *)(lVar5 + (long)itime.field_0.i[uVar23] * 0x38)
                                            + uVar30 * 4);
                                auVar144 = *(undefined1 (*) [16])
                                            ((long)&((&((Intersectors *)valid_i)->ptr)
                                                     [(long)itime.field_0.i[uVar23] * 7]->
                                                    super_RefCount)._vptr_RefCount + uVar30 * 4);
                                *(int *)((long)&p0.field_0 + uVar23 * 4) = auVar215._0_4_;
                                uVar24 = extractps(auVar215,1);
                                *(undefined8 *)((long)&p0.field_0 + uVar23 * 4 + 0x10) = uVar24;
                                uVar24 = extractps(auVar215,2);
                                *(undefined8 *)((long)&p0.field_0 + uVar23 * 4 + 0x20) = uVar24;
                                *(int *)((long)&p1.field_0 + uVar23 * 4) = auVar144._0_4_;
                                uVar24 = extractps(auVar144,1);
                                *(undefined8 *)((long)&p1.field_0 + uVar23 * 4 + 0x10) = uVar24;
                                uVar24 = extractps(auVar144,2);
                                *(undefined8 *)((long)&p1.field_0 + uVar23 * 4 + 0x20) = uVar24;
                                uVar31 = uVar31 ^ 1L << (uVar23 & 0x3f);
                                uVar23 = 0;
                                if (uVar31 != 0) {
                                  for (; (uVar31 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                                  }
                                }
                              } while (uVar31 != 0);
                            }
                            fVar100 = fVar100 + fVar38;
                            fVar102 = fVar102 + fVar58;
                            fVar104 = fVar104 + fVar60;
                            fVar114 = fVar114 + fVar86;
                            fVar138 = fVar138 + fVar149;
                            fVar132 = fVar132 + fVar150;
                            fVar140 = fVar140 + fVar151;
                            fVar211 = fVar211 + fVar152;
                            fVar120 = fVar120 + fVar116;
                            fVar139 = fVar139 + fVar128;
                            fVar167 = fVar167 + fVar130;
                            fVar203 = fVar203 + fVar141;
                            fVar232 = fVar232 + fVar63;
                            fVar235 = fVar235 + fVar160;
                            fVar238 = fVar238 + fVar165;
                            fVar241 = fVar241 + fVar170;
                            fVar153 = fVar153 + fVar155;
                            fVar158 = fVar158 + fVar161;
                            fVar163 = fVar163 + fVar166;
                            fVar168 = fVar168 + fVar171;
                            fVar157 = fVar157 + fVar39;
                            fVar162 = fVar162 + fVar59;
                            fVar197 = fVar197 + fVar61;
                            fVar202 = fVar202 + fVar64;
                            local_18d8 = local_18d8 + fVar65;
                            fStack_18d4 = fStack_18d4 + fVar66;
                            fStack_18d0 = fStack_18d0 + fVar67;
                            fStack_18cc = fStack_18cc + fVar78;
                            local_1a38 = local_1a38 + fVar79;
                            fStack_1a34 = fStack_1a34 + fVar80;
                            fStack_1a30 = fStack_1a30 + fVar81;
                            fStack_1a2c = fStack_1a2c + fVar82;
                            local_1a18 = local_1a18 + fVar83;
                            fStack_1a14 = fStack_1a14 + fVar84;
                            fStack_1a10 = fStack_1a10 + fVar85;
                            fStack_1a0c = fStack_1a0c + fVar87;
                            fVar38 = (float)p1.field_0._0_4_ * fVar205 +
                                     (float)p0.field_0._0_4_ * fVar62;
                            fVar60 = (float)p1.field_0._4_4_ * fVar208 +
                                     (float)p0.field_0._4_4_ * fVar106;
                            fVar116 = (float)p1.field_0._8_4_ * fVar209 +
                                      (float)p0.field_0._8_4_ * fVar134;
                            fVar130 = (float)p1.field_0._12_4_ * fVar210 +
                                      (float)p0.field_0._12_4_ * fVar118;
                            fVar58 = (float)p1.field_0._16_4_ * fVar205 +
                                     (float)p0.field_0._16_4_ * fVar62;
                            fVar86 = (float)p1.field_0._20_4_ * fVar208 +
                                     (float)p0.field_0._20_4_ * fVar106;
                            fVar128 = (float)p1.field_0._24_4_ * fVar209 +
                                      (float)p0.field_0._24_4_ * fVar134;
                            fVar141 = (float)p1.field_0._28_4_ * fVar210 +
                                      (float)p0.field_0._28_4_ * fVar118;
                            fVar205 = fVar205 * (float)p1.field_0._32_4_ +
                                      fVar62 * (float)p0.field_0._32_4_;
                            fVar208 = fVar208 * (float)p1.field_0._36_4_ +
                                      fVar106 * (float)p0.field_0._36_4_;
                            fVar209 = fVar209 * (float)p1.field_0._40_4_ +
                                      fVar134 * (float)p0.field_0._40_4_;
                            fVar210 = fVar210 * (float)p1.field_0._44_4_ +
                                      fVar118 * (float)p0.field_0._44_4_;
                          }
                          fVar62 = *(float *)ray;
                          fVar106 = *(float *)(ray + 4);
                          fVar134 = *(float *)(ray + 8);
                          fVar118 = *(float *)(ray + 0xc);
                          fVar149 = *(float *)(ray + 0x10);
                          fVar150 = *(float *)(ray + 0x14);
                          fVar151 = *(float *)(ray + 0x18);
                          fVar152 = *(float *)(ray + 0x1c);
                          fVar63 = *(float *)(ray + 0x20);
                          fVar160 = *(float *)(ray + 0x24);
                          fVar165 = *(float *)(ray + 0x28);
                          fVar170 = *(float *)(ray + 0x2c);
                          uVar24 = *(undefined8 *)(ray + 0x50);
                          auVar15 = *(undefined1 (*) [12])(ray + 0x50);
                          local_19f8 = (float)uVar24;
                          fStack_19f4 = (float)((ulong)uVar24 >> 0x20);
                          fStack_19f0 = (float)*(undefined8 *)(ray + 0x58);
                          fStack_19ec = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                          fVar100 = fVar100 - fVar62;
                          fVar102 = fVar102 - fVar106;
                          fVar104 = fVar104 - fVar134;
                          fVar114 = fVar114 - fVar118;
                          fVar138 = fVar138 - fVar149;
                          fVar132 = fVar132 - fVar150;
                          fVar140 = fVar140 - fVar151;
                          fVar211 = fVar211 - fVar152;
                          fVar120 = fVar120 - fVar63;
                          fVar139 = fVar139 - fVar160;
                          fVar167 = fVar167 - fVar165;
                          fVar203 = fVar203 - fVar170;
                          fVar121 = fVar232 - fVar62;
                          fVar129 = fVar235 - fVar106;
                          fVar131 = fVar238 - fVar134;
                          fVar133 = fVar241 - fVar118;
                          fVar154 = fVar153 - fVar149;
                          fVar159 = fVar158 - fVar150;
                          fVar164 = fVar163 - fVar151;
                          fVar169 = fVar168 - fVar152;
                          fVar172 = fVar157 - fVar63;
                          fVar178 = fVar162 - fVar160;
                          fVar181 = fVar197 - fVar165;
                          fVar184 = fVar202 - fVar170;
                          fVar62 = fVar38 - fVar62;
                          fVar106 = fVar60 - fVar106;
                          fVar134 = fVar116 - fVar134;
                          fVar118 = fVar130 - fVar118;
                          fVar149 = fVar58 - fVar149;
                          fVar150 = fVar86 - fVar150;
                          fVar151 = fVar128 - fVar151;
                          fVar152 = fVar141 - fVar152;
                          fVar63 = fVar205 - fVar63;
                          fVar160 = fVar208 - fVar160;
                          fVar165 = fVar209 - fVar165;
                          fVar170 = fVar210 - fVar170;
                          fVar220 = fVar62 - fVar100;
                          fVar226 = fVar106 - fVar102;
                          fVar228 = fVar134 - fVar104;
                          fVar230 = fVar118 - fVar114;
                          fVar87 = fVar149 - fVar138;
                          fVar101 = fVar150 - fVar132;
                          fVar103 = fVar151 - fVar140;
                          fVar105 = fVar152 - fVar211;
                          fVar65 = fVar63 - fVar120;
                          fVar78 = fVar160 - fVar139;
                          fVar81 = fVar165 - fVar167;
                          fVar84 = fVar170 - fVar203;
                          fVar155 = *(float *)(ray + 0x60);
                          fVar161 = *(float *)(ray + 100);
                          fVar166 = *(float *)(ray + 0x68);
                          fVar171 = *(float *)(ray + 0x6c);
                          fVar39 = fVar100 - fVar121;
                          fVar59 = fVar102 - fVar129;
                          fVar61 = fVar104 - fVar131;
                          fVar64 = fVar114 - fVar133;
                          fVar66 = auVar15._0_4_;
                          fVar79 = auVar15._4_4_;
                          fVar82 = auVar15._8_4_;
                          fVar221 = fVar138 - fVar154;
                          fVar227 = fVar132 - fVar159;
                          fVar229 = fVar140 - fVar164;
                          fVar231 = fVar211 - fVar169;
                          local_18b8 = (float)*(undefined8 *)(ray + 0x40);
                          fStack_18b4 = (float)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
                          fStack_18b0 = (float)*(undefined8 *)(ray + 0x48);
                          fStack_18ac = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
                          fVar233 = (fVar87 * (fVar63 + fVar120) - (fVar149 + fVar138) * fVar65) *
                                    local_18b8 +
                                    ((fVar62 + fVar100) * fVar65 - (fVar63 + fVar120) * fVar220) *
                                    fVar66 + (fVar220 * (fVar149 + fVar138) -
                                             (fVar62 + fVar100) * fVar87) * fVar155;
                          fVar236 = (fVar101 * (fVar160 + fVar139) - (fVar150 + fVar132) * fVar78) *
                                    fStack_18b4 +
                                    ((fVar106 + fVar102) * fVar78 - (fVar160 + fVar139) * fVar226) *
                                    fVar79 + (fVar226 * (fVar150 + fVar132) -
                                             (fVar106 + fVar102) * fVar101) * fVar161;
                          fVar239 = (fVar103 * (fVar165 + fVar167) - (fVar151 + fVar140) * fVar81) *
                                    fStack_18b0 +
                                    ((fVar134 + fVar104) * fVar81 - (fVar165 + fVar167) * fVar228) *
                                    fVar82 + (fVar228 * (fVar151 + fVar140) -
                                             (fVar134 + fVar104) * fVar103) * fVar166;
                          fVar242 = (fVar105 * (fVar170 + fVar203) - (fVar152 + fVar211) * fVar84) *
                                    fStack_18ac +
                                    ((fVar118 + fVar114) * fVar84 - (fVar170 + fVar203) * fVar230) *
                                    fStack_19ec +
                                    (fVar230 * (fVar152 + fVar211) - (fVar118 + fVar114) * fVar105)
                                    * fVar171;
                          fVar173 = fVar120 - fVar172;
                          fVar179 = fVar139 - fVar178;
                          fVar182 = fVar167 - fVar181;
                          fVar185 = fVar203 - fVar184;
                          auVar187._0_4_ =
                               (fVar221 * (fVar120 + fVar172) - (fVar138 + fVar154) * fVar173) *
                               local_18b8 +
                               ((fVar100 + fVar121) * fVar173 - (fVar120 + fVar172) * fVar39) *
                               fVar66 + (fVar39 * (fVar138 + fVar154) -
                                        (fVar100 + fVar121) * fVar221) * fVar155;
                          auVar187._4_4_ =
                               (fVar227 * (fVar139 + fVar178) - (fVar132 + fVar159) * fVar179) *
                               fStack_18b4 +
                               ((fVar102 + fVar129) * fVar179 - (fVar139 + fVar178) * fVar59) *
                               fVar79 + (fVar59 * (fVar132 + fVar159) -
                                        (fVar102 + fVar129) * fVar227) * fVar161;
                          auVar187._8_4_ =
                               (fVar229 * (fVar167 + fVar181) - (fVar140 + fVar164) * fVar182) *
                               fStack_18b0 +
                               ((fVar104 + fVar131) * fVar182 - (fVar167 + fVar181) * fVar61) *
                               fVar82 + (fVar61 * (fVar140 + fVar164) -
                                        (fVar104 + fVar131) * fVar229) * fVar166;
                          auVar187._12_4_ =
                               (fVar231 * (fVar203 + fVar184) - (fVar211 + fVar169) * fVar185) *
                               fStack_18ac +
                               ((fVar114 + fVar133) * fVar185 - (fVar203 + fVar184) * fVar64) *
                               fStack_19ec +
                               (fVar64 * (fVar211 + fVar169) - (fVar114 + fVar133) * fVar231) *
                               fVar171;
                          fVar107 = fVar121 - fVar62;
                          fVar115 = fVar129 - fVar106;
                          fVar117 = fVar131 - fVar134;
                          fVar119 = fVar133 - fVar118;
                          fVar67 = fVar154 - fVar149;
                          fVar80 = fVar159 - fVar150;
                          fVar83 = fVar164 - fVar151;
                          fVar85 = fVar169 - fVar152;
                          fVar194 = fVar172 - fVar63;
                          fVar198 = fVar178 - fVar160;
                          fVar200 = fVar181 - fVar165;
                          fVar204 = fVar184 - fVar170;
                          auVar217._0_4_ =
                               (fVar67 * (fVar63 + fVar172) - (fVar149 + fVar154) * fVar194) *
                               local_18b8 +
                               ((fVar62 + fVar121) * fVar194 - (fVar63 + fVar172) * fVar107) *
                               fVar66 + (fVar107 * (fVar149 + fVar154) - (fVar62 + fVar121) * fVar67
                                        ) * fVar155;
                          auVar217._4_4_ =
                               (fVar80 * (fVar160 + fVar178) - (fVar150 + fVar159) * fVar198) *
                               fStack_18b4 +
                               ((fVar106 + fVar129) * fVar198 - (fVar160 + fVar178) * fVar115) *
                               fVar79 + (fVar115 * (fVar150 + fVar159) -
                                        (fVar106 + fVar129) * fVar80) * fVar161;
                          auVar217._8_4_ =
                               (fVar83 * (fVar165 + fVar181) - (fVar151 + fVar164) * fVar200) *
                               fStack_18b0 +
                               ((fVar134 + fVar131) * fVar200 - (fVar165 + fVar181) * fVar117) *
                               fVar82 + (fVar117 * (fVar151 + fVar164) -
                                        (fVar134 + fVar131) * fVar83) * fVar166;
                          auVar217._12_4_ =
                               (fVar85 * (fVar170 + fVar184) - (fVar152 + fVar169) * fVar204) *
                               fStack_18ac +
                               ((fVar118 + fVar133) * fVar204 - (fVar170 + fVar184) * fVar119) *
                               fStack_19ec +
                               (fVar119 * (fVar152 + fVar169) - (fVar118 + fVar133) * fVar85) *
                               fVar171;
                          auVar92._0_4_ = fVar233 + auVar187._0_4_ + auVar217._0_4_;
                          auVar92._4_4_ = fVar236 + auVar187._4_4_ + auVar217._4_4_;
                          auVar92._8_4_ = fVar239 + auVar187._8_4_ + auVar217._8_4_;
                          auVar92._12_4_ = fVar242 + auVar187._12_4_ + auVar217._12_4_;
                          auVar45._4_4_ = fVar236;
                          auVar45._0_4_ = fVar233;
                          auVar45._8_4_ = fVar239;
                          auVar45._12_4_ = fVar242;
                          auVar215 = minps(auVar45,auVar187);
                          auVar215 = minps(auVar215,auVar217);
                          auVar143._4_4_ = fVar236;
                          auVar143._0_4_ = fVar233;
                          auVar143._8_4_ = fVar239;
                          auVar143._12_4_ = fVar242;
                          auVar144 = maxps(auVar143,auVar187);
                          auVar144 = maxps(auVar144,auVar217);
                          uVar31 = CONCAT44(auVar92._4_4_,auVar92._0_4_);
                          fVar62 = ABS(auVar92._8_4_) * 1.1920929e-07;
                          fVar106 = ABS(auVar92._12_4_) * 1.1920929e-07;
                          local_1ab8 = auVar142._0_4_;
                          uStack_1ab4 = auVar142._4_4_;
                          uStack_1ab0 = auVar142._8_4_;
                          uStack_1aac = auVar142._12_4_;
                          auVar145._0_4_ =
                               -(uint)(auVar144._0_4_ <= ABS(auVar92._0_4_) * 1.1920929e-07 ||
                                      -(ABS(auVar92._0_4_) * 1.1920929e-07) <= auVar215._0_4_) &
                               local_1ab8;
                          auVar145._4_4_ =
                               -(uint)(auVar144._4_4_ <= ABS(auVar92._4_4_) * 1.1920929e-07 ||
                                      -(ABS(auVar92._4_4_) * 1.1920929e-07) <= auVar215._4_4_) &
                               uStack_1ab4;
                          auVar145._8_4_ =
                               -(uint)(auVar144._8_4_ <= fVar62 || -fVar62 <= auVar215._8_4_) &
                               uStack_1ab0;
                          auVar145._12_4_ =
                               -(uint)(auVar144._12_4_ <= fVar106 || -fVar106 <= auVar215._12_4_) &
                               uStack_1aac;
                          iVar18 = movmskps((int)uVar23,auVar145);
                          if (iVar18 == 0) {
LAB_0024e0de:
                            auVar137._4_4_ = fStack_1a34;
                            auVar137._0_4_ = local_1a38;
                            auVar137._8_4_ = fStack_1a30;
                            auVar137._12_4_ = fStack_1a2c;
                          }
                          else {
                            auVar206._0_4_ = fVar87 * fVar173 - fVar221 * fVar65;
                            auVar206._4_4_ = fVar101 * fVar179 - fVar227 * fVar78;
                            auVar206._8_4_ = fVar103 * fVar182 - fVar229 * fVar81;
                            auVar206._12_4_ = fVar105 * fVar185 - fVar231 * fVar84;
                            auVar176._0_4_ = fVar221 * fVar194 - fVar67 * fVar173;
                            auVar176._4_4_ = fVar227 * fVar198 - fVar80 * fVar179;
                            auVar176._8_4_ = fVar229 * fVar200 - fVar83 * fVar182;
                            auVar176._12_4_ = fVar231 * fVar204 - fVar85 * fVar185;
                            auVar46._4_4_ = -(uint)(ABS(fVar227 * fVar78) < ABS(fVar80 * fVar179));
                            auVar46._0_4_ = -(uint)(ABS(fVar221 * fVar65) < ABS(fVar67 * fVar173));
                            auVar46._8_4_ = -(uint)(ABS(fVar229 * fVar81) < ABS(fVar83 * fVar182));
                            auVar46._12_4_ = -(uint)(ABS(fVar231 * fVar84) < ABS(fVar85 * fVar185));
                            auVar88 = blendvps(auVar176,auVar206,auVar46);
                            auVar156._0_4_ = fVar65 * fVar39 - fVar220 * fVar173;
                            auVar156._4_4_ = fVar78 * fVar59 - fVar226 * fVar179;
                            auVar156._8_4_ = fVar81 * fVar61 - fVar228 * fVar182;
                            auVar156._12_4_ = fVar84 * fVar64 - fVar230 * fVar185;
                            auVar109._0_4_ = fVar107 * fVar173 - fVar39 * fVar194;
                            auVar109._4_4_ = fVar115 * fVar179 - fVar59 * fVar198;
                            auVar109._8_4_ = fVar117 * fVar182 - fVar61 * fVar200;
                            auVar109._12_4_ = fVar119 * fVar185 - fVar64 * fVar204;
                            auVar47._4_4_ = -(uint)(ABS(fVar226 * fVar179) < ABS(fVar59 * fVar198));
                            auVar47._0_4_ = -(uint)(ABS(fVar220 * fVar173) < ABS(fVar39 * fVar194));
                            auVar47._8_4_ = -(uint)(ABS(fVar228 * fVar182) < ABS(fVar61 * fVar200));
                            auVar47._12_4_ = -(uint)(ABS(fVar230 * fVar185) < ABS(fVar64 * fVar204))
                            ;
                            auVar144 = blendvps(auVar109,auVar156,auVar47);
                            auVar223._0_4_ = fVar39 * fVar67 - fVar107 * fVar221;
                            auVar223._4_4_ = fVar59 * fVar80 - fVar115 * fVar227;
                            auVar223._8_4_ = fVar61 * fVar83 - fVar117 * fVar229;
                            auVar223._12_4_ = fVar64 * fVar85 - fVar119 * fVar231;
                            auVar48._4_4_ = -(uint)(ABS(fVar59 * fVar101) < ABS(fVar115 * fVar227));
                            auVar48._0_4_ = -(uint)(ABS(fVar39 * fVar87) < ABS(fVar107 * fVar221));
                            auVar48._8_4_ = -(uint)(ABS(fVar61 * fVar103) < ABS(fVar117 * fVar229));
                            auVar48._12_4_ = -(uint)(ABS(fVar64 * fVar105) < ABS(fVar119 * fVar231))
                            ;
                            auVar11._4_4_ = fVar226 * fVar227 - fVar59 * fVar101;
                            auVar11._0_4_ = fVar220 * fVar221 - fVar39 * fVar87;
                            auVar11._8_4_ = fVar228 * fVar229 - fVar61 * fVar103;
                            auVar11._12_4_ = fVar230 * fVar231 - fVar64 * fVar105;
                            auVar224 = blendvps(auVar223,auVar11,auVar48);
                            fVar62 = local_18b8 * auVar88._0_4_ +
                                     local_19f8 * auVar144._0_4_ + fVar155 * auVar224._0_4_;
                            fVar106 = fStack_18b4 * auVar88._4_4_ +
                                      fStack_19f4 * auVar144._4_4_ + fVar161 * auVar224._4_4_;
                            fVar134 = fStack_18b0 * auVar88._8_4_ +
                                      fStack_19f0 * auVar144._8_4_ + fVar166 * auVar224._8_4_;
                            fVar118 = fStack_18ac * auVar88._12_4_ +
                                      fStack_19ec * auVar144._12_4_ + fVar171 * auVar224._12_4_;
                            auVar122._0_4_ = fVar62 + fVar62;
                            auVar122._4_4_ = fVar106 + fVar106;
                            auVar122._8_4_ = fVar134 + fVar134;
                            auVar122._12_4_ = fVar118 + fVar118;
                            auVar49._0_4_ = fVar120 * auVar224._0_4_;
                            auVar49._4_4_ = fVar139 * auVar224._4_4_;
                            auVar49._8_4_ = fVar167 * auVar224._8_4_;
                            auVar49._12_4_ = fVar203 * auVar224._12_4_;
                            fVar138 = fVar100 * auVar88._0_4_ +
                                      fVar138 * auVar144._0_4_ + auVar49._0_4_;
                            fVar120 = fVar102 * auVar88._4_4_ +
                                      fVar132 * auVar144._4_4_ + auVar49._4_4_;
                            fVar132 = fVar104 * auVar88._8_4_ +
                                      fVar140 * auVar144._8_4_ + auVar49._8_4_;
                            fVar139 = fVar114 * auVar88._12_4_ +
                                      fVar211 * auVar144._12_4_ + auVar49._12_4_;
                            auVar215 = rcpps(auVar49,auVar122);
                            fVar62 = auVar215._0_4_;
                            fVar106 = auVar215._4_4_;
                            fVar134 = auVar215._8_4_;
                            fVar118 = auVar215._12_4_;
                            auVar93._0_4_ =
                                 ((1.0 - auVar122._0_4_ * fVar62) * fVar62 + fVar62) *
                                 (fVar138 + fVar138);
                            auVar93._4_4_ =
                                 ((1.0 - auVar122._4_4_ * fVar106) * fVar106 + fVar106) *
                                 (fVar120 + fVar120);
                            auVar93._8_4_ =
                                 ((1.0 - auVar122._8_4_ * fVar134) * fVar134 + fVar134) *
                                 (fVar132 + fVar132);
                            auVar93._12_4_ =
                                 ((1.0 - auVar122._12_4_ * fVar118) * fVar118 + fVar118) *
                                 (fVar139 + fVar139);
                            auVar215 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar123._0_4_ =
                                 (int)((uint)(auVar122._0_4_ != 0.0 &&
                                             (auVar93._0_4_ <= auVar215._0_4_ &&
                                             *(float *)(ray + 0x30) <= auVar93._0_4_)) * -0x80000000
                                      ) >> 0x1f;
                            auVar123._4_4_ =
                                 (int)((uint)(auVar122._4_4_ != 0.0 &&
                                             (auVar93._4_4_ <= auVar215._4_4_ &&
                                             *(float *)(ray + 0x34) <= auVar93._4_4_)) * -0x80000000
                                      ) >> 0x1f;
                            auVar123._8_4_ =
                                 (int)((uint)(auVar122._8_4_ != 0.0 &&
                                             (auVar93._8_4_ <= auVar215._8_4_ &&
                                             *(float *)(ray + 0x38) <= auVar93._8_4_)) * -0x80000000
                                      ) >> 0x1f;
                            auVar123._12_4_ =
                                 (int)((uint)(auVar122._12_4_ != 0.0 &&
                                             (auVar93._12_4_ <= auVar215._12_4_ &&
                                             *(float *)(ray + 0x3c) <= auVar93._12_4_)) *
                                      -0x80000000) >> 0x1f;
                            iVar18 = movmskps(iVar18,auVar123 & auVar145);
                            if (iVar18 == 0) goto LAB_0024e0de;
                            uVar199 = pGVar4->mask;
                            auVar71._0_4_ = -(uint)((uVar199 & *(uint *)(ray + 0x90)) == 0);
                            auVar71._4_4_ = -(uint)((uVar199 & *(uint *)(ray + 0x94)) == 0);
                            auVar71._8_4_ = -(uint)((uVar199 & *(uint *)(ray + 0x98)) == 0);
                            auVar71._12_4_ = -(uint)((uVar199 & *(uint *)(ray + 0x9c)) == 0);
                            aVar72 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                     (~auVar71 & auVar123 & auVar145);
                            iVar18 = movmskps(iVar18,(undefined1  [16])aVar72);
                            if (iVar18 == 0) {
                              auVar137._4_4_ = fStack_1a34;
                              auVar137._0_4_ = local_1a38;
                              auVar137._8_4_ = fStack_1a30;
                              auVar137._12_4_ = fStack_1a2c;
                            }
                            else {
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                                auVar137._4_4_ = fStack_1a34;
                                auVar137._0_4_ = local_1a38;
                                auVar137._8_4_ = fStack_1a30;
                                auVar137._12_4_ = fStack_1a2c;
                              }
                              else {
                                auVar108 = rcpps(ZEXT416(uVar199),auVar92);
                                fVar62 = auVar108._0_4_;
                                fVar106 = auVar108._4_4_;
                                fVar134 = auVar108._8_4_;
                                fVar118 = auVar108._12_4_;
                                fVar120 = (float)DAT_01feca10;
                                fVar132 = DAT_01feca10._4_4_;
                                fVar139 = DAT_01feca10._12_4_;
                                fVar138 = DAT_01feca10._8_4_;
                                local_1748 = (float)(uVar31 & 0x7fffffff7fffffff);
                                fStack_1744 = (float)((uVar31 & 0x7fffffff7fffffff) >> 0x20);
                                fVar62 = (float)(-(uint)(1e-18 <= local_1748) &
                                                (uint)((fVar120 - auVar92._0_4_ * fVar62) * fVar62 +
                                                      fVar62));
                                fVar106 = (float)(-(uint)(1e-18 <= fStack_1744) &
                                                 (uint)((fVar132 - auVar92._4_4_ * fVar106) *
                                                        fVar106 + fVar106));
                                fVar134 = (float)(-(uint)(1e-18 <= ABS(auVar92._8_4_)) &
                                                 (uint)((fVar138 - auVar92._8_4_ * fVar134) *
                                                        fVar134 + fVar134));
                                fVar118 = (float)(-(uint)(1e-18 <= ABS(auVar92._12_4_)) &
                                                 (uint)((fVar139 - auVar92._12_4_ * fVar118) *
                                                        fVar118 + fVar118));
                                auVar147._0_4_ = fVar233 * fVar62;
                                auVar147._4_4_ = fVar236 * fVar106;
                                auVar147._8_4_ = fVar239 * fVar134;
                                auVar147._12_4_ = fVar242 * fVar118;
                                auVar108 = minps(auVar147,_DAT_01feca10);
                                auVar188._0_4_ = auVar187._0_4_ * fVar62;
                                auVar188._4_4_ = auVar187._4_4_ * fVar106;
                                auVar188._8_4_ = auVar187._8_4_ * fVar134;
                                auVar188._12_4_ = auVar187._12_4_ * fVar118;
                                auVar68 = minps(auVar188,_DAT_01feca10);
                                auVar126._0_4_ = fVar120 - auVar108._0_4_;
                                auVar126._4_4_ = fVar132 - auVar108._4_4_;
                                auVar126._8_4_ = fVar138 - auVar108._8_4_;
                                auVar126._12_4_ = fVar139 - auVar108._12_4_;
                                auVar14._8_8_ = uVar17;
                                auVar14._0_8_ = uVar16;
                                blendvps(auVar108,auVar126,auVar14);
                                auVar136._0_4_ = fVar120 - auVar68._0_4_;
                                auVar136._4_4_ = fVar132 - auVar68._4_4_;
                                auVar136._8_4_ = fVar138 - auVar68._8_4_;
                                auVar136._12_4_ = fVar139 - auVar68._12_4_;
                                blendvps(auVar68,auVar136,auVar14);
                                p0.field_0._0_16_ = auVar88;
                                p0.field_0._16_16_ = auVar144;
                                p0.field_0._32_16_ = auVar224;
                                auVar144 = blendvps(auVar215,auVar93,(undefined1  [16])aVar72);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar144;
                                itime.field_0 = aVar72;
                                p1.field_0._0_8_ = &itime;
                                p1.field_0._8_8_ = pGVar4->userPtr;
                                p1.field_0._16_8_ = context->user;
                                p1.field_0._24_8_ = ray;
                                p1.field_0._32_8_ = &p0;
                                p1.field_0._40_4_ = 4;
                                uVar24 = pGVar4->occlusionFilterN;
                                if ((RTCFilterFunctionN)uVar24 != (RTCFilterFunctionN)0x0) {
                                  valid_i = (vint<4> *)&p1;
                                  uVar24 = (*(code *)uVar24)((RTCFilterFunctionNArguments *)valid_i)
                                  ;
                                }
                                if (itime.field_0 ==
                                    (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                  auVar96._8_4_ = 0xffffffff;
                                  auVar96._0_8_ = 0xffffffffffffffff;
                                  auVar96._12_4_ = 0xffffffff;
                                  auVar96 = auVar96 ^ _DAT_01febe20;
                                  auVar137._4_4_ = fStack_1a34;
                                  auVar137._0_4_ = local_1a38;
                                  auVar137._8_4_ = fStack_1a30;
                                  auVar137._12_4_ = fStack_1a2c;
                                }
                                else {
                                  p_Var7 = context->args->filter;
                                  auVar137._4_4_ = fStack_1a34;
                                  auVar137._0_4_ = local_1a38;
                                  auVar137._8_4_ = fStack_1a30;
                                  auVar137._12_4_ = fStack_1a2c;
                                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                    valid_i = (vint<4> *)&p1;
                                    (*p_Var7)((RTCFilterFunctionNArguments *)valid_i);
                                  }
                                  auVar55._0_4_ = -(uint)(itime.field_0.i[0] == 0);
                                  auVar55._4_4_ = -(uint)(itime.field_0.i[1] == 0);
                                  auVar55._8_4_ = -(uint)(itime.field_0.i[2] == 0);
                                  auVar55._12_4_ = -(uint)(itime.field_0.i[3] == 0);
                                  auVar96 = auVar55 ^ _DAT_01febe20;
                                  auVar144 = blendvps(_DAT_01feba00,
                                                      *(undefined1 (*) [16])
                                                       (p1.field_0._24_8_ + 0x80),auVar55);
                                  *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar144;
                                  uVar24 = p1.field_0._24_8_;
                                }
                                uVar196 = (uint)uVar24;
                                auVar98._0_4_ = auVar96._0_4_ << 0x1f;
                                auVar98._4_4_ = auVar96._4_4_ << 0x1f;
                                auVar98._8_4_ = auVar96._8_4_ << 0x1f;
                                auVar98._12_4_ = auVar96._12_4_ << 0x1f;
                                aVar72._0_4_ = auVar98._0_4_ >> 0x1f;
                                aVar72._4_4_ = auVar98._4_4_ >> 0x1f;
                                aVar72._8_4_ = auVar98._8_4_ >> 0x1f;
                                aVar72._12_4_ = auVar98._12_4_ >> 0x1f;
                                auVar215 = blendvps(auVar215,*(undefined1 (*) [16])(ray + 0x80),
                                                    auVar98);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar215;
                              }
                              auVar142 = ~(undefined1  [16])aVar72 & auVar142;
                            }
                          }
                          iVar18 = movmskps(uVar196,auVar142);
                          if (iVar18 == 0) {
                            uVar196 = 0;
                          }
                          else {
                            fVar62 = *(float *)ray;
                            fVar106 = *(float *)(ray + 4);
                            fVar134 = *(float *)(ray + 8);
                            fVar118 = *(float *)(ray + 0xc);
                            fVar138 = *(float *)(ray + 0x10);
                            fVar120 = *(float *)(ray + 0x14);
                            fVar132 = *(float *)(ray + 0x18);
                            fVar139 = *(float *)(ray + 0x1c);
                            fVar140 = *(float *)(ray + 0x20);
                            fVar167 = *(float *)(ray + 0x24);
                            fVar211 = *(float *)(ray + 0x28);
                            fVar203 = *(float *)(ray + 0x2c);
                            auVar215 = *(undefined1 (*) [16])(ray + 0x40);
                            fVar100 = auVar215._0_4_;
                            fVar102 = auVar215._4_4_;
                            fVar104 = auVar215._8_4_;
                            fVar114 = auVar215._12_4_;
                            local_18d8 = local_18d8 - fVar62;
                            fStack_18d4 = fStack_18d4 - fVar106;
                            fStack_18d0 = fStack_18d0 - fVar134;
                            fStack_18cc = fStack_18cc - fVar118;
                            fVar149 = auVar137._0_4_ - fVar138;
                            fVar150 = auVar137._4_4_ - fVar120;
                            fVar151 = auVar137._8_4_ - fVar132;
                            fVar152 = auVar137._12_4_ - fVar139;
                            local_1a18 = local_1a18 - fVar140;
                            fStack_1a14 = fStack_1a14 - fVar167;
                            fStack_1a10 = fStack_1a10 - fVar211;
                            fStack_1a0c = fStack_1a0c - fVar203;
                            fVar38 = fVar38 - fVar62;
                            fVar60 = fVar60 - fVar106;
                            fVar116 = fVar116 - fVar134;
                            fVar130 = fVar130 - fVar118;
                            fVar58 = fVar58 - fVar138;
                            fVar86 = fVar86 - fVar120;
                            fVar128 = fVar128 - fVar132;
                            fVar141 = fVar141 - fVar139;
                            fVar205 = fVar205 - fVar140;
                            fVar208 = fVar208 - fVar167;
                            fVar209 = fVar209 - fVar211;
                            fVar210 = fVar210 - fVar203;
                            fVar232 = fVar232 - fVar62;
                            fVar235 = fVar235 - fVar106;
                            fVar238 = fVar238 - fVar134;
                            fVar241 = fVar241 - fVar118;
                            fVar153 = fVar153 - fVar138;
                            fVar158 = fVar158 - fVar120;
                            fVar163 = fVar163 - fVar132;
                            fVar168 = fVar168 - fVar139;
                            fVar157 = fVar157 - fVar140;
                            fVar162 = fVar162 - fVar167;
                            fVar197 = fVar197 - fVar211;
                            fVar202 = fVar202 - fVar203;
                            fVar63 = fVar232 - local_18d8;
                            fVar160 = fVar235 - fStack_18d4;
                            fVar165 = fVar238 - fStack_18d0;
                            fVar170 = fVar241 - fStack_18cc;
                            fVar115 = fVar153 - fVar149;
                            fVar117 = fVar158 - fVar150;
                            fVar119 = fVar163 - fVar151;
                            fVar121 = fVar168 - fVar152;
                            fVar39 = fVar157 - local_1a18;
                            fVar61 = fVar162 - fStack_1a14;
                            fVar65 = fVar197 - fStack_1a10;
                            fVar67 = fVar202 - fStack_1a0c;
                            fVar62 = *(float *)(ray + 0x60);
                            fVar106 = *(float *)(ray + 100);
                            fVar134 = *(float *)(ray + 0x68);
                            fVar118 = *(float *)(ray + 0x6c);
                            fVar101 = local_18d8 - fVar38;
                            fVar103 = fStack_18d4 - fVar60;
                            fVar105 = fStack_18d0 - fVar116;
                            fVar107 = fStack_18cc - fVar130;
                            local_1a48 = (float)*(undefined8 *)(ray + 0x50);
                            fStack_1a44 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
                            fStack_1a40 = (float)*(undefined8 *)(ray + 0x58);
                            fStack_1a3c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                            fVar59 = fVar149 - fVar58;
                            fVar64 = fVar150 - fVar86;
                            fVar66 = fVar151 - fVar128;
                            fVar78 = fVar152 - fVar141;
                            fVar155 = (fVar115 * (fVar157 + local_1a18) -
                                      (fVar153 + fVar149) * fVar39) * fVar100 +
                                      ((fVar232 + local_18d8) * fVar39 -
                                      (fVar157 + local_1a18) * fVar63) * local_1a48 +
                                      (fVar63 * (fVar153 + fVar149) -
                                      (fVar232 + local_18d8) * fVar115) * fVar62;
                            fVar161 = (fVar117 * (fVar162 + fStack_1a14) -
                                      (fVar158 + fVar150) * fVar61) * fVar102 +
                                      ((fVar235 + fStack_18d4) * fVar61 -
                                      (fVar162 + fStack_1a14) * fVar160) * fStack_1a44 +
                                      (fVar160 * (fVar158 + fVar150) -
                                      (fVar235 + fStack_18d4) * fVar117) * fVar106;
                            fVar166 = (fVar119 * (fVar197 + fStack_1a10) -
                                      (fVar163 + fVar151) * fVar65) * fVar104 +
                                      ((fVar238 + fStack_18d0) * fVar65 -
                                      (fVar197 + fStack_1a10) * fVar165) * fStack_1a40 +
                                      (fVar165 * (fVar163 + fVar151) -
                                      (fVar238 + fStack_18d0) * fVar119) * fVar134;
                            fVar171 = (fVar121 * (fVar202 + fStack_1a0c) -
                                      (fVar168 + fVar152) * fVar67) * fVar114 +
                                      ((fVar241 + fStack_18cc) * fVar67 -
                                      (fVar202 + fStack_1a0c) * fVar170) * fStack_1a3c +
                                      (fVar170 * (fVar168 + fVar152) -
                                      (fVar241 + fStack_18cc) * fVar121) * fVar118;
                            fVar140 = local_1a18 - fVar205;
                            fVar167 = fStack_1a14 - fVar208;
                            fVar211 = fStack_1a10 - fVar209;
                            fVar203 = fStack_1a0c - fVar210;
                            auVar146._0_4_ =
                                 (fVar59 * (local_1a18 + fVar205) - (fVar149 + fVar58) * fVar140) *
                                 fVar100 + ((local_18d8 + fVar38) * fVar140 -
                                           (local_1a18 + fVar205) * fVar101) * local_1a48 +
                                           (fVar101 * (fVar149 + fVar58) -
                                           (local_18d8 + fVar38) * fVar59) * fVar62;
                            auVar146._4_4_ =
                                 (fVar64 * (fStack_1a14 + fVar208) - (fVar150 + fVar86) * fVar167) *
                                 fVar102 + ((fStack_18d4 + fVar60) * fVar167 -
                                           (fStack_1a14 + fVar208) * fVar103) * fStack_1a44 +
                                           (fVar103 * (fVar150 + fVar86) -
                                           (fStack_18d4 + fVar60) * fVar64) * fVar106;
                            auVar146._8_4_ =
                                 (fVar66 * (fStack_1a10 + fVar209) - (fVar151 + fVar128) * fVar211)
                                 * fVar104 +
                                 ((fStack_18d0 + fVar116) * fVar211 -
                                 (fStack_1a10 + fVar209) * fVar105) * fStack_1a40 +
                                 (fVar105 * (fVar151 + fVar128) - (fStack_18d0 + fVar116) * fVar66)
                                 * fVar134;
                            auVar146._12_4_ =
                                 (fVar78 * (fStack_1a0c + fVar210) - (fVar152 + fVar141) * fVar203)
                                 * fVar114 +
                                 ((fStack_18cc + fVar130) * fVar203 -
                                 (fStack_1a0c + fVar210) * fVar107) * fStack_1a3c +
                                 (fVar107 * (fVar152 + fVar141) - (fStack_18cc + fVar130) * fVar78)
                                 * fVar118;
                            fVar79 = fVar38 - fVar232;
                            fVar80 = fVar60 - fVar235;
                            fVar81 = fVar116 - fVar238;
                            fVar82 = fVar130 - fVar241;
                            fVar83 = fVar58 - fVar153;
                            fVar84 = fVar86 - fVar158;
                            fVar85 = fVar128 - fVar163;
                            fVar87 = fVar141 - fVar168;
                            fVar138 = fVar205 - fVar157;
                            fVar120 = fVar208 - fVar162;
                            fVar132 = fVar209 - fVar197;
                            fVar139 = fVar210 - fVar202;
                            auVar50._0_4_ =
                                 (fVar83 * (fVar157 + fVar205) - (fVar153 + fVar58) * fVar138) *
                                 fVar100 + ((fVar232 + fVar38) * fVar138 -
                                           (fVar157 + fVar205) * fVar79) * local_1a48 +
                                           (fVar79 * (fVar153 + fVar58) -
                                           (fVar232 + fVar38) * fVar83) * fVar62;
                            auVar50._4_4_ =
                                 (fVar84 * (fVar162 + fVar208) - (fVar158 + fVar86) * fVar120) *
                                 fVar102 + ((fVar235 + fVar60) * fVar120 -
                                           (fVar162 + fVar208) * fVar80) * fStack_1a44 +
                                           (fVar80 * (fVar158 + fVar86) -
                                           (fVar235 + fVar60) * fVar84) * fVar106;
                            auVar50._8_4_ =
                                 (fVar85 * (fVar197 + fVar209) - (fVar163 + fVar128) * fVar132) *
                                 fVar104 + ((fVar238 + fVar116) * fVar132 -
                                           (fVar197 + fVar209) * fVar81) * fStack_1a40 +
                                           (fVar81 * (fVar163 + fVar128) -
                                           (fVar238 + fVar116) * fVar85) * fVar134;
                            auVar50._12_4_ =
                                 (fVar87 * (fVar202 + fVar210) - (fVar168 + fVar141) * fVar139) *
                                 fVar114 + ((fVar241 + fVar130) * fVar139 -
                                           (fVar202 + fVar210) * fVar82) * fStack_1a3c +
                                           (fVar82 * (fVar168 + fVar141) -
                                           (fVar241 + fVar130) * fVar87) * fVar118;
                            auVar94._0_4_ = fVar155 + auVar146._0_4_ + auVar50._0_4_;
                            auVar94._4_4_ = fVar161 + auVar146._4_4_ + auVar50._4_4_;
                            auVar94._8_4_ = fVar166 + auVar146._8_4_ + auVar50._8_4_;
                            auVar94._12_4_ = fVar171 + auVar146._12_4_ + auVar50._12_4_;
                            auVar73._8_4_ = fVar166;
                            auVar73._0_8_ = CONCAT44(fVar161,fVar155);
                            auVar73._12_4_ = fVar171;
                            auVar215 = minps(auVar73,auVar146);
                            auVar215 = minps(auVar215,auVar50);
                            auVar110._8_4_ = fVar166;
                            auVar110._0_8_ = CONCAT44(fVar161,fVar155);
                            auVar110._12_4_ = fVar171;
                            auVar144 = maxps(auVar110,auVar146);
                            auVar144 = maxps(auVar144,auVar50);
                            uVar196 = (uint)DAT_01fec6c0;
                            uVar199 = DAT_01fec6c0._4_4_;
                            uVar201 = DAT_01fec6c0._8_4_;
                            uVar180 = DAT_01fec6c0._12_4_;
                            fVar205 = (float)((uint)auVar94._0_4_ & uVar196) * 1.1920929e-07;
                            fVar208 = (float)((uint)auVar94._4_4_ & uVar199) * 1.1920929e-07;
                            fVar209 = (float)((uint)auVar94._8_4_ & uVar201) * 1.1920929e-07;
                            fVar210 = (float)((uint)auVar94._12_4_ & uVar180) * 1.1920929e-07;
                            auVar111._4_4_ = -(uint)(auVar144._4_4_ <= fVar208);
                            auVar111._0_4_ = -(uint)(auVar144._0_4_ <= fVar205);
                            auVar111._8_4_ = -(uint)(auVar144._8_4_ <= fVar209);
                            auVar111._12_4_ = -(uint)(auVar144._12_4_ <= fVar210);
                            auVar74._4_4_ = -(uint)(-fVar208 <= auVar215._4_4_);
                            auVar74._0_4_ = -(uint)(-fVar205 <= auVar215._0_4_);
                            auVar74._8_4_ = -(uint)(-fVar209 <= auVar215._8_4_);
                            auVar74._12_4_ = -(uint)(-fVar210 <= auVar215._12_4_);
                            auVar111 = auVar111 | auVar74;
                            auVar112._0_4_ = auVar111._0_4_ & auVar142._0_4_;
                            auVar112._4_4_ = auVar111._4_4_ & auVar142._4_4_;
                            auVar112._8_4_ = auVar111._8_4_ & auVar142._8_4_;
                            auVar112._12_4_ = auVar111._12_4_ & auVar142._12_4_;
                            iVar18 = movmskps(iVar18,auVar112);
                            if (iVar18 == 0) {
                              uVar183 = 0;
                            }
                            else {
                              auVar207._0_4_ = fVar115 * fVar140 - fVar59 * fVar39;
                              auVar207._4_4_ = fVar117 * fVar167 - fVar64 * fVar61;
                              auVar207._8_4_ = fVar119 * fVar211 - fVar66 * fVar65;
                              auVar207._12_4_ = fVar121 * fVar203 - fVar78 * fVar67;
                              auVar177._0_4_ = fVar59 * fVar138 - fVar83 * fVar140;
                              auVar177._4_4_ = fVar64 * fVar120 - fVar84 * fVar167;
                              auVar177._8_4_ = fVar66 * fVar132 - fVar85 * fVar211;
                              auVar177._12_4_ = fVar78 * fVar139 - fVar87 * fVar203;
                              auVar51._4_4_ =
                                   -(uint)((float)((uint)(fVar64 * fVar61) & uVar199) <
                                          (float)((uint)(fVar84 * fVar167) & uVar199));
                              auVar51._0_4_ =
                                   -(uint)((float)((uint)(fVar59 * fVar39) & uVar196) <
                                          (float)((uint)(fVar83 * fVar140) & uVar196));
                              auVar51._8_4_ =
                                   -(uint)((float)((uint)(fVar66 * fVar65) & uVar201) <
                                          (float)((uint)(fVar85 * fVar211) & uVar201));
                              auVar51._12_4_ =
                                   -(uint)((float)((uint)(fVar78 * fVar67) & uVar180) <
                                          (float)((uint)(fVar87 * fVar203) & uVar180));
                              auVar144 = blendvps(auVar177,auVar207,auVar51);
                              auVar218._0_4_ = fVar39 * fVar101 - fVar63 * fVar140;
                              auVar218._4_4_ = fVar61 * fVar103 - fVar160 * fVar167;
                              auVar218._8_4_ = fVar65 * fVar105 - fVar165 * fVar211;
                              auVar218._12_4_ = fVar67 * fVar107 - fVar170 * fVar203;
                              auVar195._0_4_ = fVar79 * fVar140 - fVar101 * fVar138;
                              auVar195._4_4_ = fVar80 * fVar167 - fVar103 * fVar120;
                              auVar195._8_4_ = fVar81 * fVar211 - fVar105 * fVar132;
                              auVar195._12_4_ = fVar82 * fVar203 - fVar107 * fVar139;
                              auVar52._4_4_ =
                                   -(uint)((float)((uint)(fVar160 * fVar167) & uVar199) <
                                          (float)((uint)(fVar103 * fVar120) & uVar199));
                              auVar52._0_4_ =
                                   -(uint)((float)((uint)(fVar63 * fVar140) & uVar196) <
                                          (float)((uint)(fVar101 * fVar138) & uVar196));
                              auVar52._8_4_ =
                                   -(uint)((float)((uint)(fVar165 * fVar211) & uVar201) <
                                          (float)((uint)(fVar105 * fVar132) & uVar201));
                              auVar52._12_4_ =
                                   -(uint)((float)((uint)(fVar170 * fVar203) & uVar180) <
                                          (float)((uint)(fVar107 * fVar139) & uVar180));
                              auVar88 = blendvps(auVar195,auVar218,auVar52);
                              auVar135._0_4_ = fVar63 * fVar59 - fVar101 * fVar115;
                              auVar135._4_4_ = fVar160 * fVar64 - fVar103 * fVar117;
                              auVar135._8_4_ = fVar165 * fVar66 - fVar105 * fVar119;
                              auVar135._12_4_ = fVar170 * fVar78 - fVar107 * fVar121;
                              auVar225._0_4_ = fVar101 * fVar83 - fVar79 * fVar59;
                              auVar225._4_4_ = fVar103 * fVar84 - fVar80 * fVar64;
                              auVar225._8_4_ = fVar105 * fVar85 - fVar81 * fVar66;
                              auVar225._12_4_ = fVar107 * fVar87 - fVar82 * fVar78;
                              auVar53._4_4_ =
                                   -(uint)((float)((uint)(fVar103 * fVar117) & uVar199) <
                                          (float)((uint)(fVar80 * fVar64) & uVar199));
                              auVar53._0_4_ =
                                   -(uint)((float)((uint)(fVar101 * fVar115) & uVar196) <
                                          (float)((uint)(fVar79 * fVar59) & uVar196));
                              auVar53._8_4_ =
                                   -(uint)((float)((uint)(fVar105 * fVar119) & uVar201) <
                                          (float)((uint)(fVar81 * fVar66) & uVar201));
                              auVar53._12_4_ =
                                   -(uint)((float)((uint)(fVar107 * fVar121) & uVar180) <
                                          (float)((uint)(fVar82 * fVar78) & uVar180));
                              auVar224 = blendvps(auVar225,auVar135,auVar53);
                              fVar205 = fVar100 * auVar144._0_4_ +
                                        local_1a48 * auVar88._0_4_ + fVar62 * auVar224._0_4_;
                              fVar208 = fVar102 * auVar144._4_4_ +
                                        fStack_1a44 * auVar88._4_4_ + fVar106 * auVar224._4_4_;
                              fVar209 = fVar104 * auVar144._8_4_ +
                                        fStack_1a40 * auVar88._8_4_ + fVar134 * auVar224._8_4_;
                              fVar210 = fVar114 * auVar144._12_4_ +
                                        fStack_1a3c * auVar88._12_4_ + fVar118 * auVar224._12_4_;
                              auVar124._0_4_ = fVar205 + fVar205;
                              auVar124._4_4_ = fVar208 + fVar208;
                              auVar124._8_4_ = fVar209 + fVar209;
                              auVar124._12_4_ = fVar210 + fVar210;
                              auVar54._0_4_ = local_1a18 * auVar224._0_4_;
                              auVar54._4_4_ = fStack_1a14 * auVar224._4_4_;
                              auVar54._8_4_ = fStack_1a10 * auVar224._8_4_;
                              auVar54._12_4_ = fStack_1a0c * auVar224._12_4_;
                              fVar62 = local_18d8 * auVar144._0_4_ +
                                       fVar149 * auVar88._0_4_ + auVar54._0_4_;
                              fVar106 = fStack_18d4 * auVar144._4_4_ +
                                        fVar150 * auVar88._4_4_ + auVar54._4_4_;
                              fVar134 = fStack_18d0 * auVar144._8_4_ +
                                        fVar151 * auVar88._8_4_ + auVar54._8_4_;
                              fVar118 = fStack_18cc * auVar144._12_4_ +
                                        fVar152 * auVar88._12_4_ + auVar54._12_4_;
                              auVar215 = rcpps(auVar54,auVar124);
                              fVar205 = auVar215._0_4_;
                              fVar208 = auVar215._4_4_;
                              fVar209 = auVar215._8_4_;
                              fVar210 = auVar215._12_4_;
                              auVar95._0_4_ =
                                   ((1.0 - auVar124._0_4_ * fVar205) * fVar205 + fVar205) *
                                   (fVar62 + fVar62);
                              auVar95._4_4_ =
                                   ((1.0 - auVar124._4_4_ * fVar208) * fVar208 + fVar208) *
                                   (fVar106 + fVar106);
                              auVar95._8_4_ =
                                   ((1.0 - auVar124._8_4_ * fVar209) * fVar209 + fVar209) *
                                   (fVar134 + fVar134);
                              auVar95._12_4_ =
                                   ((1.0 - auVar124._12_4_ * fVar210) * fVar210 + fVar210) *
                                   (fVar118 + fVar118);
                              auVar215 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar125._0_4_ =
                                   (int)((uint)(auVar124._0_4_ != 0.0 &&
                                               (auVar95._0_4_ <= auVar215._0_4_ &&
                                               *(float *)(ray + 0x30) <= auVar95._0_4_)) *
                                        -0x80000000) >> 0x1f;
                              auVar125._4_4_ =
                                   (int)((uint)(auVar124._4_4_ != 0.0 &&
                                               (auVar95._4_4_ <= auVar215._4_4_ &&
                                               *(float *)(ray + 0x34) <= auVar95._4_4_)) *
                                        -0x80000000) >> 0x1f;
                              auVar125._8_4_ =
                                   (int)((uint)(auVar124._8_4_ != 0.0 &&
                                               (auVar95._8_4_ <= auVar215._8_4_ &&
                                               *(float *)(ray + 0x38) <= auVar95._8_4_)) *
                                        -0x80000000) >> 0x1f;
                              auVar125._12_4_ =
                                   (int)((uint)(auVar124._12_4_ != 0.0 &&
                                               (auVar95._12_4_ <= auVar215._12_4_ &&
                                               *(float *)(ray + 0x3c) <= auVar95._12_4_)) *
                                        -0x80000000) >> 0x1f;
                              iVar18 = movmskps(iVar18,auVar125 & auVar112);
                              if (iVar18 == 0) {
                                uVar183 = 0;
                              }
                              else {
                                uVar183 = *(uint *)(lVar32 + 0x40 + uVar35 * 4);
                                pRVar6 = (context->scene->geometries).items;
                                pGVar4 = pRVar6[uVar183].ptr;
                                uVar186 = pGVar4->mask;
                                auVar75._0_4_ = -(uint)((uVar186 & *(uint *)(ray + 0x90)) == 0);
                                auVar75._4_4_ = -(uint)((uVar186 & *(uint *)(ray + 0x94)) == 0);
                                auVar75._8_4_ = -(uint)((uVar186 & *(uint *)(ray + 0x98)) == 0);
                                auVar75._12_4_ = -(uint)((uVar186 & *(uint *)(ray + 0x9c)) == 0);
                                aVar76 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                         (~auVar75 & auVar125 & auVar112);
                                iVar18 = movmskps((int)pRVar6,(undefined1  [16])aVar76);
                                if (iVar18 != 0) {
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar108 = rcpps(ZEXT416(uVar186),auVar94);
                                    fVar205 = auVar108._0_4_;
                                    fVar208 = auVar108._4_4_;
                                    fVar209 = auVar108._8_4_;
                                    fVar210 = auVar108._12_4_;
                                    fVar106 = (float)DAT_01feca10;
                                    fVar134 = DAT_01feca10._4_4_;
                                    fVar118 = DAT_01feca10._12_4_;
                                    fVar62 = DAT_01feca10._8_4_;
                                    fVar205 = (float)(-(uint)(1e-18 <= (float)((uint)auVar94._0_4_ &
                                                                              uVar196)) &
                                                     (uint)((fVar106 - auVar94._0_4_ * fVar205) *
                                                            fVar205 + fVar205));
                                    fVar208 = (float)(-(uint)(1e-18 <= (float)((uint)auVar94._4_4_ &
                                                                              uVar199)) &
                                                     (uint)((fVar134 - auVar94._4_4_ * fVar208) *
                                                            fVar208 + fVar208));
                                    fVar209 = (float)(-(uint)(1e-18 <= (float)((uint)auVar94._8_4_ &
                                                                              uVar201)) &
                                                     (uint)((fVar62 - auVar94._8_4_ * fVar209) *
                                                            fVar209 + fVar209));
                                    fVar210 = (float)(-(uint)(1e-18 <= (float)((uint)auVar94._12_4_
                                                                              & uVar180)) &
                                                     (uint)((fVar118 - auVar94._12_4_ * fVar210) *
                                                            fVar210 + fVar210));
                                    auVar148._0_4_ = fVar155 * fVar205;
                                    auVar148._4_4_ = fVar161 * fVar208;
                                    auVar148._8_4_ = fVar166 * fVar209;
                                    auVar148._12_4_ = fVar171 * fVar210;
                                    auVar108 = minps(auVar148,_DAT_01feca10);
                                    auVar189._0_4_ = auVar146._0_4_ * fVar205;
                                    auVar189._4_4_ = auVar146._4_4_ * fVar208;
                                    auVar189._8_4_ = auVar146._8_4_ * fVar209;
                                    auVar189._12_4_ = auVar146._12_4_ * fVar210;
                                    auVar68 = minps(auVar189,_DAT_01feca10);
                                    auVar113._0_4_ = fVar106 - auVar108._0_4_;
                                    auVar113._4_4_ = fVar134 - auVar108._4_4_;
                                    auVar113._8_4_ = fVar62 - auVar108._8_4_;
                                    auVar113._12_4_ = fVar118 - auVar108._12_4_;
                                    blendvps(auVar108,auVar113,auVar77);
                                    auVar127._0_4_ = fVar106 - auVar68._0_4_;
                                    auVar127._4_4_ = fVar134 - auVar68._4_4_;
                                    auVar127._8_4_ = fVar62 - auVar68._8_4_;
                                    auVar127._12_4_ = fVar118 - auVar68._12_4_;
                                    blendvps(auVar68,auVar127,auVar77);
                                    p0.field_0._0_16_ = auVar144;
                                    p0.field_0._16_16_ = auVar88;
                                    p0.field_0._32_16_ = auVar224;
                                    auVar144 = blendvps(auVar215,auVar95,(undefined1  [16])aVar76);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar144;
                                    itime.field_0 = aVar76;
                                    p1.field_0._0_8_ = &itime;
                                    p1.field_0._8_8_ = pGVar4->userPtr;
                                    p1.field_0._16_8_ = context->user;
                                    p1.field_0._24_8_ = ray;
                                    p1.field_0._32_8_ = &p0;
                                    p1.field_0._40_4_ = 4;
                                    uVar24 = pGVar4->occlusionFilterN;
                                    if ((RTCFilterFunctionN)uVar24 != (RTCFilterFunctionN)0x0) {
                                      valid_i = (vint<4> *)&p1;
                                      uVar24 = (*(code *)uVar24)((RTCFilterFunctionNArguments *)
                                                                 valid_i);
                                    }
                                    if (itime.field_0 ==
                                        (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                      auVar97._8_4_ = 0xffffffff;
                                      auVar97._0_8_ = 0xffffffffffffffff;
                                      auVar97._12_4_ = 0xffffffff;
                                      auVar97 = auVar97 ^ _DAT_01febe20;
                                    }
                                    else {
                                      p_Var7 = context->args->filter;
                                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                        valid_i = (vint<4> *)&p1;
                                        (*p_Var7)((RTCFilterFunctionNArguments *)valid_i);
                                      }
                                      auVar56._0_4_ = -(uint)(itime.field_0.i[0] == 0);
                                      auVar56._4_4_ = -(uint)(itime.field_0.i[1] == 0);
                                      auVar56._8_4_ = -(uint)(itime.field_0.i[2] == 0);
                                      auVar56._12_4_ = -(uint)(itime.field_0.i[3] == 0);
                                      auVar97 = auVar56 ^ _DAT_01febe20;
                                      auVar144 = blendvps(_DAT_01feba00,
                                                          *(undefined1 (*) [16])
                                                           (p1.field_0._24_8_ + 0x80),auVar56);
                                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar144;
                                      uVar24 = p1.field_0._24_8_;
                                    }
                                    uVar183 = (uint)uVar24;
                                    auVar99._0_4_ = auVar97._0_4_ << 0x1f;
                                    auVar99._4_4_ = auVar97._4_4_ << 0x1f;
                                    auVar99._8_4_ = auVar97._8_4_ << 0x1f;
                                    auVar99._12_4_ = auVar97._12_4_ << 0x1f;
                                    aVar76._0_4_ = auVar99._0_4_ >> 0x1f;
                                    aVar76._4_4_ = auVar99._4_4_ >> 0x1f;
                                    aVar76._8_4_ = auVar99._8_4_ >> 0x1f;
                                    aVar76._12_4_ = auVar99._12_4_ >> 0x1f;
                                    auVar215 = blendvps(auVar215,*(undefined1 (*) [16])(ray + 0x80),
                                                        auVar99);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar215;
                                  }
                                  auVar142 = ~(undefined1  [16])aVar76 & auVar142;
                                }
                              }
                            }
                            iVar18 = movmskps(uVar183,auVar142);
                            uVar196 = CONCAT31((int3)((uint)iVar18 >> 8),iVar18 != 0);
                          }
                          iVar240 = 0x7f800000;
                          iVar237 = 0x7f800000;
                          iVar234 = 0x7f800000;
                          iVar18 = 0x7f800000;
                          uVar23 = (ulong)uVar196;
                          if (((char)uVar196 == '\0') ||
                             (uVar23 = uVar35 + 1, bVar37 = 2 < uVar35, uVar35 = uVar23, bVar37))
                          break;
                        }
                        local_19d8._0_8_ =
                             CONCAT44(local_19d8._4_4_ & auVar142._4_4_,
                                      local_19d8._0_4_ & auVar142._0_4_);
                        local_19d8._8_4_ = local_19d8._8_4_ & auVar142._8_4_;
                        local_19d8._12_4_ = local_19d8._12_4_ & auVar142._12_4_;
                        iVar19 = movmskps((int)uVar23,local_19d8);
                      } while ((iVar19 != 0) && (uVar20 = uVar20 + 1, uVar20 < uVar21));
                      aVar57._0_8_ = local_19d8._0_8_ ^ 0xffffffffffffffff;
                      aVar57._8_4_ = local_19d8._8_4_ ^ 0xffffffff;
                      aVar57._12_4_ = local_19d8._12_4_ ^ 0xffffffff;
                    }
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         ((undefined1  [16])aVar57 | (undefined1  [16])terminated.field_0);
                    iVar19 = movmskps((int)uVar20,(undefined1  [16])terminated.field_0);
                    if (iVar19 == 0xf) goto LAB_0024eb34;
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                                  (undefined1  [16])terminated.field_0);
                    iVar19 = 0;
                    break;
                  }
                  goto LAB_0024eb45;
                }
                uVar20 = root.ptr & 0xfffffffffffffff0;
                uVar196 = (uint)root.ptr & 7;
                aVar222.i[1] = iVar234;
                aVar222.i[0] = iVar18;
                aVar222.i[2] = iVar237;
                aVar222.i[3] = iVar240;
                pIVar27 = (Intersectors *)0x0;
                sVar28 = 8;
                do {
                  sVar3 = *(size_t *)(uVar20 + (long)pIVar27 * 8);
                  root.ptr = sVar28;
                  aVar90 = aVar222;
                  if (sVar3 != 8) {
                    fVar62 = *(float *)(uVar20 + 0x80 + (long)pIVar27 * 4);
                    fVar106 = *(float *)(uVar20 + 0x20 + (long)pIVar27 * 4);
                    fVar134 = *(float *)(uVar20 + 0x30 + (long)pIVar27 * 4);
                    fVar118 = *(float *)(uVar20 + 0x40 + (long)pIVar27 * 4);
                    fVar138 = *(float *)(uVar20 + 0x50 + (long)pIVar27 * 4);
                    auVar142 = *(undefined1 (*) [16])(ray + 0x70);
                    fVar86 = auVar142._0_4_;
                    fVar100 = auVar142._4_4_;
                    fVar102 = auVar142._8_4_;
                    fVar104 = auVar142._12_4_;
                    fVar120 = *(float *)(uVar20 + 0xa0 + (long)pIVar27 * 4);
                    fVar132 = *(float *)(uVar20 + 0xc0 + (long)pIVar27 * 4);
                    fVar139 = *(float *)(uVar20 + 0x60 + (long)pIVar27 * 4);
                    fVar140 = *(float *)(uVar20 + 0x90 + (long)pIVar27 * 4);
                    fVar167 = *(float *)(uVar20 + 0xb0 + (long)pIVar27 * 4);
                    fVar211 = *(float *)(uVar20 + 0xd0 + (long)pIVar27 * 4);
                    fVar203 = *(float *)(uVar20 + 0x70 + (long)pIVar27 * 4);
                    fVar197 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
                    fVar202 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
                    fVar38 = ((fVar62 * fVar86 + fVar106) - (float)tray.org.field_0._0_4_) *
                             tray.rdir.field_0._0_4_;
                    fVar58 = ((fVar62 * fVar100 + fVar106) - (float)tray.org.field_0._4_4_) *
                             tray.rdir.field_0._4_4_;
                    fVar60 = ((fVar62 * fVar102 + fVar106) - (float)tray.org.field_0._8_4_) *
                             tray.rdir.field_0._8_4_;
                    fVar62 = ((fVar62 * fVar104 + fVar106) - (float)tray.org.field_0._12_4_) *
                             tray.rdir.field_0._12_4_;
                    fVar106 = ((fVar120 * fVar86 + fVar118) - (float)tray.org.field_0._16_4_) *
                              tray.rdir.field_0._16_4_;
                    fVar114 = ((fVar120 * fVar100 + fVar118) - (float)tray.org.field_0._20_4_) *
                              tray.rdir.field_0._20_4_;
                    fVar116 = ((fVar120 * fVar102 + fVar118) - (float)tray.org.field_0._24_4_) *
                              tray.rdir.field_0._24_4_;
                    fVar118 = ((fVar120 * fVar104 + fVar118) - (float)tray.org.field_0._28_4_) *
                              tray.rdir.field_0._28_4_;
                    fVar120 = ((fVar132 * fVar86 + fVar139) - (float)tray.org.field_0._32_8_) *
                              (float)tray.rdir.field_0._32_4_;
                    fVar128 = ((fVar132 * fVar100 + fVar139) - fVar197) *
                              (float)tray.rdir.field_0._36_4_;
                    fVar130 = ((fVar132 * fVar102 + fVar139) - (float)tray.org.field_0._40_8_) *
                              (float)tray.rdir.field_0._40_4_;
                    fVar132 = ((fVar132 * fVar104 + fVar139) - fVar202) *
                              (float)tray.rdir.field_0._44_4_;
                    fVar141 = ((fVar140 * fVar86 + fVar134) - (float)tray.org.field_0._0_4_) *
                              tray.rdir.field_0._0_4_;
                    fVar149 = ((fVar140 * fVar100 + fVar134) - (float)tray.org.field_0._4_4_) *
                              tray.rdir.field_0._4_4_;
                    fVar150 = ((fVar140 * fVar102 + fVar134) - (float)tray.org.field_0._8_4_) *
                              tray.rdir.field_0._8_4_;
                    fVar151 = ((fVar140 * fVar104 + fVar134) - (float)tray.org.field_0._12_4_) *
                              tray.rdir.field_0._12_4_;
                    fVar152 = ((fVar167 * fVar86 + fVar138) - (float)tray.org.field_0._16_4_) *
                              tray.rdir.field_0._16_4_;
                    fVar157 = ((fVar167 * fVar100 + fVar138) - (float)tray.org.field_0._20_4_) *
                              tray.rdir.field_0._20_4_;
                    fVar162 = ((fVar167 * fVar102 + fVar138) - (float)tray.org.field_0._24_4_) *
                              tray.rdir.field_0._24_4_;
                    fVar167 = ((fVar167 * fVar104 + fVar138) - (float)tray.org.field_0._28_4_) *
                              tray.rdir.field_0._28_4_;
                    fVar134 = ((fVar211 * fVar86 + fVar203) - (float)tray.org.field_0._32_8_) *
                              (float)tray.rdir.field_0._32_4_;
                    fVar138 = ((fVar211 * fVar100 + fVar203) - fVar197) *
                              (float)tray.rdir.field_0._36_4_;
                    fVar139 = ((fVar211 * fVar102 + fVar203) - (float)tray.org.field_0._40_8_) *
                              (float)tray.rdir.field_0._40_4_;
                    fVar140 = ((fVar211 * fVar104 + fVar203) - fVar202) *
                              (float)tray.rdir.field_0._44_4_;
                    uVar199 = (uint)((int)fVar141 < (int)fVar38) * (int)fVar141 |
                              (uint)((int)fVar141 >= (int)fVar38) * (int)fVar38;
                    uVar201 = (uint)((int)fVar149 < (int)fVar58) * (int)fVar149 |
                              (uint)((int)fVar149 >= (int)fVar58) * (int)fVar58;
                    uVar180 = (uint)((int)fVar150 < (int)fVar60) * (int)fVar150 |
                              (uint)((int)fVar150 >= (int)fVar60) * (int)fVar60;
                    uVar183 = (uint)((int)fVar151 < (int)fVar62) * (int)fVar151 |
                              (uint)((int)fVar151 >= (int)fVar62) * (int)fVar62;
                    uVar186 = (uint)((int)fVar152 < (int)fVar106) * (int)fVar152 |
                              (uint)((int)fVar152 >= (int)fVar106) * (int)fVar106;
                    uVar190 = (uint)((int)fVar157 < (int)fVar114) * (int)fVar157 |
                              (uint)((int)fVar157 >= (int)fVar114) * (int)fVar114;
                    uVar191 = (uint)((int)fVar162 < (int)fVar116) * (int)fVar162 |
                              (uint)((int)fVar162 >= (int)fVar116) * (int)fVar116;
                    uVar192 = (uint)((int)fVar167 < (int)fVar118) * (int)fVar167 |
                              (uint)((int)fVar167 >= (int)fVar118) * (int)fVar118;
                    uVar186 = ((int)uVar186 < (int)uVar199) * uVar199 |
                              ((int)uVar186 >= (int)uVar199) * uVar186;
                    uVar190 = ((int)uVar190 < (int)uVar201) * uVar201 |
                              ((int)uVar190 >= (int)uVar201) * uVar190;
                    uVar191 = ((int)uVar191 < (int)uVar180) * uVar180 |
                              ((int)uVar191 >= (int)uVar180) * uVar191;
                    uVar192 = ((int)uVar192 < (int)uVar183) * uVar183 |
                              ((int)uVar192 >= (int)uVar183) * uVar192;
                    uVar199 = (uint)((int)fVar134 < (int)fVar120) * (int)fVar134 |
                              (uint)((int)fVar134 >= (int)fVar120) * (int)fVar120;
                    uVar201 = (uint)((int)fVar138 < (int)fVar128) * (int)fVar138 |
                              (uint)((int)fVar138 >= (int)fVar128) * (int)fVar128;
                    uVar180 = (uint)((int)fVar139 < (int)fVar130) * (int)fVar139 |
                              (uint)((int)fVar139 >= (int)fVar130) * (int)fVar130;
                    uVar183 = (uint)((int)fVar140 < (int)fVar132) * (int)fVar140 |
                              (uint)((int)fVar140 >= (int)fVar132) * (int)fVar132;
                    auVar175._0_4_ =
                         (float)(((int)uVar199 < (int)uVar186) * uVar186 |
                                ((int)uVar199 >= (int)uVar186) * uVar199) * 0.99999964;
                    auVar175._4_4_ =
                         (float)(((int)uVar201 < (int)uVar190) * uVar190 |
                                ((int)uVar201 >= (int)uVar190) * uVar201) * 0.99999964;
                    auVar175._8_4_ =
                         (float)(((int)uVar180 < (int)uVar191) * uVar191 |
                                ((int)uVar180 >= (int)uVar191) * uVar180) * 0.99999964;
                    auVar175._12_4_ =
                         (float)(((int)uVar183 < (int)uVar192) * uVar192 |
                                ((int)uVar183 >= (int)uVar192) * uVar183) * 0.99999964;
                    uVar199 = (uint)((int)fVar141 < (int)fVar38) * (int)fVar38 |
                              (uint)((int)fVar141 >= (int)fVar38) * (int)fVar141;
                    uVar201 = (uint)((int)fVar149 < (int)fVar58) * (int)fVar58 |
                              (uint)((int)fVar149 >= (int)fVar58) * (int)fVar149;
                    uVar180 = (uint)((int)fVar150 < (int)fVar60) * (int)fVar60 |
                              (uint)((int)fVar150 >= (int)fVar60) * (int)fVar150;
                    uVar183 = (uint)((int)fVar151 < (int)fVar62) * (int)fVar62 |
                              (uint)((int)fVar151 >= (int)fVar62) * (int)fVar151;
                    uVar186 = (uint)((int)fVar152 < (int)fVar106) * (int)fVar106 |
                              (uint)((int)fVar152 >= (int)fVar106) * (int)fVar152;
                    uVar190 = (uint)((int)fVar157 < (int)fVar114) * (int)fVar114 |
                              (uint)((int)fVar157 >= (int)fVar114) * (int)fVar157;
                    uVar191 = (uint)((int)fVar162 < (int)fVar116) * (int)fVar116 |
                              (uint)((int)fVar162 >= (int)fVar116) * (int)fVar162;
                    uVar192 = (uint)((int)fVar167 < (int)fVar118) * (int)fVar118 |
                              (uint)((int)fVar167 >= (int)fVar118) * (int)fVar167;
                    uVar186 = ((int)uVar199 < (int)uVar186) * uVar199 |
                              ((int)uVar199 >= (int)uVar186) * uVar186;
                    uVar190 = ((int)uVar201 < (int)uVar190) * uVar201 |
                              ((int)uVar201 >= (int)uVar190) * uVar190;
                    uVar191 = ((int)uVar180 < (int)uVar191) * uVar180 |
                              ((int)uVar180 >= (int)uVar191) * uVar191;
                    uVar192 = ((int)uVar183 < (int)uVar192) * uVar183 |
                              ((int)uVar183 >= (int)uVar192) * uVar192;
                    uVar199 = (uint)((int)fVar134 < (int)fVar120) * (int)fVar120 |
                              (uint)((int)fVar134 >= (int)fVar120) * (int)fVar134;
                    uVar201 = (uint)((int)fVar138 < (int)fVar128) * (int)fVar128 |
                              (uint)((int)fVar138 >= (int)fVar128) * (int)fVar138;
                    uVar180 = (uint)((int)fVar139 < (int)fVar130) * (int)fVar130 |
                              (uint)((int)fVar139 >= (int)fVar130) * (int)fVar139;
                    uVar183 = (uint)((int)fVar140 < (int)fVar132) * (int)fVar132 |
                              (uint)((int)fVar140 >= (int)fVar132) * (int)fVar140;
                    fVar62 = (float)(((int)uVar186 < (int)uVar199) * uVar186 |
                                    ((int)uVar186 >= (int)uVar199) * uVar199) * 1.0000004;
                    fVar106 = (float)(((int)uVar190 < (int)uVar201) * uVar190 |
                                     ((int)uVar190 >= (int)uVar201) * uVar201) * 1.0000004;
                    fVar134 = (float)(((int)uVar191 < (int)uVar180) * uVar191 |
                                     ((int)uVar191 >= (int)uVar180) * uVar180) * 1.0000004;
                    fVar118 = (float)(((int)uVar192 < (int)uVar183) * uVar192 |
                                     ((int)uVar192 >= (int)uVar183) * uVar183) * 1.0000004;
                    bVar37 = (float)((uint)(tray.tnear.field_0.i[0] < (int)auVar175._0_4_) *
                                     (int)auVar175._0_4_ |
                                    (uint)(tray.tnear.field_0.i[0] >= (int)auVar175._0_4_) *
                                    tray.tnear.field_0.i[0]) <=
                             (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar62) *
                                     tray.tfar.field_0.i[0] |
                                    (uint)(tray.tfar.field_0.i[0] >= (int)fVar62) * (int)fVar62);
                    bVar8 = (float)((uint)(tray.tnear.field_0.i[1] < (int)auVar175._4_4_) *
                                    (int)auVar175._4_4_ |
                                   (uint)(tray.tnear.field_0.i[1] >= (int)auVar175._4_4_) *
                                   tray.tnear.field_0.i[1]) <=
                            (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar106) *
                                    tray.tfar.field_0.i[1] |
                                   (uint)(tray.tfar.field_0.i[1] >= (int)fVar106) * (int)fVar106);
                    bVar9 = (float)((uint)(tray.tnear.field_0.i[2] < (int)auVar175._8_4_) *
                                    (int)auVar175._8_4_ |
                                   (uint)(tray.tnear.field_0.i[2] >= (int)auVar175._8_4_) *
                                   tray.tnear.field_0.i[2]) <=
                            (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar134) *
                                    tray.tfar.field_0.i[2] |
                                   (uint)(tray.tfar.field_0.i[2] >= (int)fVar134) * (int)fVar134);
                    bVar10 = (float)((uint)(tray.tnear.field_0.i[3] < (int)auVar175._12_4_) *
                                     (int)auVar175._12_4_ |
                                    (uint)(tray.tnear.field_0.i[3] >= (int)auVar175._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                             (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar118) *
                                     tray.tfar.field_0.i[3] |
                                    (uint)(tray.tfar.field_0.i[3] >= (int)fVar118) * (int)fVar118);
                    if (uVar196 == 6) {
                      fVar62 = *(float *)(uVar20 + 0xe0 + (long)pIVar27 * 4);
                      fVar106 = *(float *)(uVar20 + 0xf0 + (long)pIVar27 * 4);
                      bVar37 = (fVar86 < fVar106 && fVar62 <= fVar86) && bVar37;
                      bVar8 = (fVar100 < fVar106 && fVar62 <= fVar100) && bVar8;
                      bVar9 = (fVar102 < fVar106 && fVar62 <= fVar102) && bVar9;
                      bVar10 = (fVar104 < fVar106 && fVar62 <= fVar104) && bVar10;
                    }
                    auVar41._0_4_ =
                         (-(uint)bVar37 & -(uint)(fVar205 < tray.tfar.field_0.v[0])) << 0x1f;
                    auVar41._4_4_ =
                         (-(uint)bVar8 & -(uint)(fVar208 < tray.tfar.field_0.v[1])) << 0x1f;
                    auVar41._8_4_ =
                         (-(uint)bVar9 & -(uint)(fVar209 < tray.tfar.field_0.v[2])) << 0x1f;
                    auVar41._12_4_ =
                         (-(uint)bVar10 & -(uint)(fVar210 < tray.tfar.field_0.v[3])) << 0x1f;
                    uVar199 = movmskps((int)valid_i,auVar41);
                    valid_i = (vint<4> *)(ulong)uVar199;
                    if ((uVar199 != 0) &&
                       (auVar89._4_4_ = iVar234, auVar89._0_4_ = iVar18, auVar89._8_4_ = iVar237,
                       auVar89._12_4_ = iVar240,
                       aVar90 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                blendvps(auVar89,auVar175,auVar41), root.ptr = sVar3, sVar28 != 8))
                    {
                      pNVar36->ptr = sVar28;
                      pNVar36 = pNVar36 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar34->v = aVar222;
                      paVar34 = paVar34 + 1;
                    }
                  }
                } while ((sVar3 != 8) &&
                        (valid_i = (vint<4> *)((long)&pIVar27->ptr + 1),
                        bVar37 = pIVar27 < (Intersectors *)0x3, pIVar27 = (Intersectors *)valid_i,
                        sVar28 = root.ptr, aVar222 = aVar90, bVar37));
                iVar19 = 0;
                if (root.ptr == 8) {
LAB_0024d458:
                  bVar37 = false;
                  iVar19 = 4;
                }
                else {
                  auVar42._4_4_ = -(uint)(aVar90.v[1] < tray.tfar.field_0.v[1]);
                  auVar42._0_4_ = -(uint)(aVar90.v[0] < tray.tfar.field_0.v[0]);
                  auVar42._8_4_ = -(uint)(aVar90.v[2] < tray.tfar.field_0.v[2]);
                  auVar42._12_4_ = -(uint)(aVar90.v[3] < tray.tfar.field_0.v[3]);
                  uVar25 = movmskps(uVar196,auVar42);
                  bVar37 = true;
                  if ((uint)POPCOUNT(uVar25) <= uVar193) {
                    pNVar36->ptr = root.ptr;
                    pNVar36 = pNVar36 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar34->v = aVar90;
                    paVar34 = paVar34 + 1;
                    goto LAB_0024d458;
                  }
                }
              } while (bVar37);
            }
          }
        }
      } while (iVar19 != 3);
      auVar77._0_4_ = uVar212 & terminated.field_0.i[0];
      auVar77._4_4_ = uVar219 & terminated.field_0.i[1];
      auVar77._8_4_ = auVar213._8_4_ & terminated.field_0.i[2];
      auVar77._12_4_ = auVar213._12_4_ & terminated.field_0.i[3];
      auVar77 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar77);
      *(undefined1 (*) [16])(ray + 0x80) = auVar77;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }